

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void snapshot_stats_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc;
  hbtrie **pphVar4;
  fdb_status fVar5;
  int iVar6;
  fdb_status fVar7;
  fdb_config *pfVar8;
  size_t sVar9;
  fdb_kvs_handle *pfVar10;
  size_t sVar11;
  size_t sVar12;
  __atomic_base<unsigned_long> handle;
  __atomic_base<unsigned_long> _Var13;
  char *handle_00;
  fdb_kvs_handle *pfVar14;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *in_RCX;
  fdb_kvs_handle *extraout_RDX;
  ulong uVar16;
  hbtrie **seqnum;
  fdb_kvs_handle *pfVar17;
  fdb_kvs_handle *doc_01;
  uint uVar18;
  char *pcVar19;
  __atomic_base<unsigned_long> _Var20;
  fdb_iterator *pfVar21;
  char *unaff_R12;
  char *unaff_R13;
  long lVar22;
  char *pcVar23;
  fdb_doc **ppfVar24;
  fdb_iterator *config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_doc *pfStack_2100;
  fdb_iterator *pfStack_20f8;
  int iStack_20ec;
  fdb_kvs_handle *pfStack_20e8;
  timeval tStack_20e0;
  fdb_kvs_handle *pfStack_20d0;
  fdb_kvs_handle *pfStack_20c8;
  fdb_kvs_handle *pfStack_20c0;
  fdb_kvs_handle *pfStack_20b8;
  fdb_iterator *pfStack_20b0;
  fdb_iterator *pfStack_20a8;
  fdb_kvs_handle *pfStack_2098;
  fdb_kvs_handle *pfStack_2090;
  undefined1 auStack_2088 [24];
  fdb_kvs_handle *pfStack_2070;
  fdb_kvs_handle *pfStack_2068;
  fdb_kvs_handle *pfStack_2060;
  fdb_kvs_handle *pfStack_2058;
  undefined1 auStack_2050 [80];
  undefined8 auStack_2000 [5];
  fdb_doc *apfStack_1fd8 [6];
  fdb_kvs_info fStack_1fa8;
  timeval tStack_1f78;
  undefined1 auStack_1f68 [280];
  fdb_iterator fStack_1e50;
  fdb_kvs_handle fStack_1d50;
  fdb_kvs_handle *pfStack_1b48;
  fdb_kvs_handle *pfStack_1b40;
  fdb_kvs_handle *pfStack_1b38;
  code *pcStack_1b30;
  fdb_kvs_handle *pfStack_1b20;
  fdb_iterator *pfStack_1b18;
  fdb_kvs_handle *pfStack_1b10;
  fdb_kvs_handle *pfStack_1b08;
  fdb_custom_cmp_variable *pp_Stack_1b00;
  size_t sStack_1af8;
  fdb_kvs_handle *pfStack_1af0;
  fdb_kvs_info fStack_1ae8;
  undefined1 auStack_1ab8 [10];
  undefined1 auStack_1aae [14];
  undefined2 uStack_1aa0;
  fdb_encryption_key afStack_19a8 [7];
  fdb_kvs_handle *pfStack_18a0;
  fdb_kvs_handle *pfStack_1898;
  fdb_kvs_handle *pfStack_1890;
  fdb_kvs_handle *pfStack_1888;
  fdb_kvs_handle *pfStack_1880;
  fdb_kvs_handle *pfStack_1878;
  undefined1 auStack_1868 [8];
  fdb_file_handle *pfStack_1860;
  fdb_kvs_handle *pfStack_1858;
  fdb_kvs_handle *pfStack_1850;
  fdb_iterator *pfStack_1848;
  undefined1 auStack_1840 [48];
  undefined1 auStack_1810 [64];
  hbtrie *phStack_17d0;
  kvs_ops_stat *pkStack_17c8;
  timeval tStack_17a0;
  btreeblk_handle *apbStack_1790 [33];
  undefined1 auStack_1688 [32];
  undefined2 uStack_1668;
  undefined1 uStack_1648;
  code *pcStack_1630;
  undefined4 uStack_1628;
  fdb_txn *pfStack_1620;
  fdb_kvs_handle *pfStack_1590;
  char acStack_1588 [256];
  fdb_kvs_handle *pfStack_1488;
  fdb_kvs_handle *pfStack_1480;
  fdb_kvs_handle *pfStack_1478;
  fdb_kvs_handle *pfStack_1470;
  fdb_kvs_handle *pfStack_1468;
  fdb_kvs_handle *pfStack_1460;
  fdb_kvs_handle *pfStack_1450;
  uint uStack_1444;
  fdb_iterator *pfStack_1440;
  fdb_kvs_handle *pfStack_1438;
  undefined4 *puStack_1430;
  fdb_kvs_handle *pfStack_1428;
  fdb_kvs_handle *pfStack_1420;
  fdb_iterator *pfStack_1418;
  fdb_file_handle *pfStack_1410;
  fdb_iterator *pfStack_1408;
  size_t sStack_1400;
  undefined1 auStack_13f8 [32];
  timeval tStack_13d8;
  undefined1 auStack_13c8 [272];
  size_t sStack_12b8;
  char *pcStack_12b0;
  uint8_t uStack_12a8;
  undefined2 uStack_12a0;
  undefined1 uStack_1280;
  fdb_kvs_handle *pfStack_11c8;
  char acStack_11c0 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_10c0;
  fdb_kvs_handle *pfStack_10b8;
  fdb_kvs_handle *pfStack_10b0;
  fdb_kvs_handle *pfStack_10a8;
  fdb_kvs_handle *pfStack_10a0;
  fdb_kvs_handle *pfStack_1098;
  fdb_kvs_handle *pfStack_1088;
  fdb_file_handle *pfStack_1080;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1078;
  fdb_doc *pfStack_1070;
  fdb_kvs_handle *pfStack_1068;
  fdb_kvs_handle *pfStack_1060;
  fdb_kvs_handle *pfStack_1058;
  fdb_kvs_handle *pfStack_1050;
  fdb_kvs_handle *pfStack_1048;
  fdb_kvs_handle *pfStack_1040;
  fdb_kvs_config fStack_1038;
  fdb_kvs_config fStack_1020;
  fdb_kvs_config fStack_1000;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_fe0 [4];
  timeval tStack_fc0;
  fdb_config fStack_fb0;
  fdb_kvs_info *pfStack_e98;
  atomic<unsigned_long> aStack_e90;
  fdb_kvs_handle *pfStack_e88;
  atomic<unsigned_long> aStack_e80;
  fdb_kvs_handle *pfStack_e78;
  atomic<unsigned_long> aStack_e70;
  fdb_kvs_handle *pfStack_e60;
  fdb_kvs_handle *pfStack_e58;
  fdb_file_handle *pfStack_e50;
  undefined1 auStack_e48 [16];
  fdb_config *pfStack_e38;
  fdb_kvs_info fStack_e30;
  fdb_kvs_config fStack_e00;
  undefined1 auStack_de8 [176];
  char acStack_d38 [256];
  undefined1 auStack_c38 [512];
  fdb_config fStack_a38;
  fdb_kvs_handle *pfStack_940;
  fdb_kvs_handle *pfStack_938;
  fdb_kvs_handle *pfStack_930;
  fdb_kvs_handle *pfStack_928;
  fdb_kvs_handle *pfStack_920;
  fdb_kvs_handle *pfStack_918;
  fdb_kvs_handle *pfStack_910;
  fdb_kvs_handle *pfStack_908;
  fdb_kvs_handle *pfStack_900;
  fdb_kvs_handle *pfStack_8f8;
  fdb_file_handle *pfStack_8f0;
  undefined4 *puStack_8e8;
  undefined1 auStack_8e0 [48];
  fdb_kvs_handle *pfStack_8b0;
  undefined1 auStack_8a8 [40];
  undefined1 auStack_880 [272];
  size_t sStack_770;
  uint8_t uStack_760;
  undefined1 uStack_758;
  undefined1 uStack_738;
  fdb_kvs_handle *pfStack_680;
  char acStack_678 [256];
  hbtrie **pphStack_578;
  fdb_kvs_handle *pfStack_570;
  fdb_kvs_handle *pfStack_568;
  fdb_config *pfStack_560;
  fdb_kvs_handle *pfStack_558;
  fdb_kvs_handle *pfStack_550;
  fdb_kvs_handle *local_538;
  hbtrie *local_530;
  undefined1 local_528 [16];
  hbtrie **local_518;
  kvs_info *local_510 [3];
  hbtrie *local_4f8;
  timeval local_4f0;
  undefined1 local_4e0 [184];
  char local_428 [256];
  undefined1 local_328 [520];
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_104;
  undefined1 local_f9;
  
  pfStack_550 = (fdb_kvs_handle *)0x1111c3;
  gettimeofday(&local_4f0,(__timezone_ptr_t)0x0);
  pfStack_550 = (fdb_kvs_handle *)0x1111c8;
  memleak_start();
  pfStack_550 = (fdb_kvs_handle *)0x1111d7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar8 = (fdb_config *)(local_328 + 0x200);
  pfStack_550 = (fdb_kvs_handle *)0x1111e7;
  fdb_get_default_config();
  pcVar19 = local_4e0;
  pfStack_550 = (fdb_kvs_handle *)0x1111f4;
  fdb_get_default_kvs_config();
  local_120 = 0;
  local_118 = 0x400;
  local_104 = 1;
  local_f9 = 0;
  pfStack_550 = (fdb_kvs_handle *)0x111219;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_550 = (fdb_kvs_handle *)0x111230;
  fVar5 = fdb_open((fdb_file_handle **)&local_530,"./mvcc_test1",pfVar8);
  handle._M_i = (__int_type)(uint)fVar5;
  pfStack_550 = (fdb_kvs_handle *)0x111242;
  fdb_kvs_open_default((fdb_file_handle *)local_530,&local_538,(fdb_kvs_config *)pcVar19);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (char *)0x0;
    uVar16 = 0;
    do {
      pfStack_550 = (fdb_kvs_handle *)0x11126a;
      sprintf(local_328 + 0x100,"key%d",uVar16 & 0xffffffff);
      pfStack_550 = (fdb_kvs_handle *)0x111282;
      sprintf(local_328,"meta%d",uVar16 & 0xffffffff);
      pfStack_550 = (fdb_kvs_handle *)0x11129a;
      sprintf(local_428,"body%d",uVar16 & 0xffffffff);
      pcVar19 = local_4e0 + (long)unaff_R12 + 0x18;
      pfStack_550 = (fdb_kvs_handle *)0x1112ad;
      unaff_R13 = (char *)strlen(local_328 + 0x100);
      handle._M_i = (__int_type)local_328;
      pfStack_550 = (fdb_kvs_handle *)0x1112c0;
      pfVar8 = (fdb_config *)strlen((char *)handle._M_i);
      pfStack_550 = (fdb_kvs_handle *)0x1112d0;
      sVar9 = strlen(local_428);
      pfStack_550 = (fdb_kvs_handle *)0x1112f5;
      in_RCX = (fdb_kvs_handle *)handle._M_i;
      fdb_doc_create((fdb_doc **)pcVar19,local_328 + 0x100,(size_t)unaff_R13,(void *)handle._M_i,
                     (size_t)pfVar8,local_428,sVar9);
      pfStack_550 = (fdb_kvs_handle *)0x111307;
      fdb_set(local_538,*(fdb_doc **)(local_4e0 + uVar16 * 8 + 0x18));
      pfStack_550 = (fdb_kvs_handle *)0x111314;
      fdb_doc_free(*(fdb_doc **)(local_4e0 + uVar16 * 8 + 0x18));
      uVar16 = uVar16 + 1;
      unaff_R12 = (char *)((long)unaff_R12 + 8);
    } while (uVar16 != 0x14);
    pfStack_550 = (fdb_kvs_handle *)0x111334;
    fdb_commit((fdb_file_handle *)local_530,'\x01');
    pfStack_550 = (fdb_kvs_handle *)0x111343;
    fVar5 = fdb_get_kvs_info(local_538,(fdb_kvs_info *)(local_528 + 8));
    seqnum = local_518;
    pphVar4 = (hbtrie **)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001114c8;
    pfStack_550 = (fdb_kvs_handle *)0x111368;
    fVar5 = fdb_set_log_callback(local_538,logCallbackFunc,"snapshot_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001114cd;
    pfStack_550 = (fdb_kvs_handle *)0x111382;
    fVar5 = fdb_snapshot_open(local_538,(fdb_kvs_handle **)local_528,(fdb_seqnum_t)seqnum);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001114d2;
    pfVar8 = (fdb_config *)&local_518;
    pfStack_550 = (fdb_kvs_handle *)0x1113a1;
    fdb_get_kvs_info((fdb_kvs_handle *)local_528._0_8_,(fdb_kvs_info *)(local_528 + 8));
    if (local_518 != seqnum) {
      pfStack_550 = (fdb_kvs_handle *)0x1113b2;
      snapshot_stats_test();
    }
    unaff_R12 = (char *)local_510;
    if (local_510[0] != (kvs_info *)0x14) {
      pfStack_550 = (fdb_kvs_handle *)0x1113c6;
      snapshot_stats_test();
    }
    pcVar19 = (char *)&local_4f8;
    if (local_4f8 != local_530) {
      pfStack_550 = (fdb_kvs_handle *)0x1113e2;
      snapshot_stats_test();
    }
    unaff_R13 = local_528;
    pfStack_550 = (fdb_kvs_handle *)0x1113f0;
    fdb_kvs_close((fdb_kvs_handle *)local_528._0_8_);
    pfStack_550 = (fdb_kvs_handle *)0x111404;
    fVar5 = fdb_snapshot_open(local_538,(fdb_kvs_handle **)unaff_R13,0xffffffffffffffff);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_550 = (fdb_kvs_handle *)0x11141e;
      fdb_get_kvs_info((fdb_kvs_handle *)local_528._0_8_,(fdb_kvs_info *)(local_528 + 8));
      if (local_518 != seqnum) {
        pfStack_550 = (fdb_kvs_handle *)0x11142f;
        snapshot_stats_test();
      }
      if (local_510[0] != (kvs_info *)0x14) {
        pfStack_550 = (fdb_kvs_handle *)0x11143f;
        snapshot_stats_test();
      }
      if (local_4f8 != local_530) {
        pfStack_550 = (fdb_kvs_handle *)0x111458;
        snapshot_stats_test();
      }
      pfStack_550 = (fdb_kvs_handle *)0x111462;
      fdb_kvs_close((fdb_kvs_handle *)local_528._0_8_);
      pfStack_550 = (fdb_kvs_handle *)0x11146c;
      fdb_kvs_close(local_538);
      pfStack_550 = (fdb_kvs_handle *)0x111476;
      fdb_close((fdb_file_handle *)local_530);
      pfStack_550 = (fdb_kvs_handle *)0x11147b;
      fdb_shutdown();
      pfStack_550 = (fdb_kvs_handle *)0x111480;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (snapshot_stats_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_550 = (fdb_kvs_handle *)0x1114b1;
      fprintf(_stderr,pcVar19,"snapshot stats test");
      return;
    }
  }
  else {
    pfStack_550 = (fdb_kvs_handle *)0x1114c8;
    snapshot_stats_test();
    pphVar4 = &local_530;
LAB_001114c8:
    seqnum = pphVar4;
    pfStack_550 = (fdb_kvs_handle *)0x1114cd;
    snapshot_stats_test();
LAB_001114cd:
    pfStack_550 = (fdb_kvs_handle *)0x1114d2;
    snapshot_stats_test();
LAB_001114d2:
    pfStack_550 = (fdb_kvs_handle *)0x1114d7;
    snapshot_stats_test();
  }
  pfStack_550 = (fdb_kvs_handle *)snapshot_with_uncomitted_data_test;
  snapshot_stats_test();
  pfStack_918 = (fdb_kvs_handle *)0x1114fc;
  pphStack_578 = seqnum;
  pfStack_570 = (fdb_kvs_handle *)unaff_R12;
  pfStack_568 = (fdb_kvs_handle *)unaff_R13;
  pfStack_560 = pfVar8;
  pfStack_558 = (fdb_kvs_handle *)pcVar19;
  pfStack_550 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_8a8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_680 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_678,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_918 = (fdb_kvs_handle *)0x111524;
  system((char *)&pfStack_680);
  pfStack_918 = (fdb_kvs_handle *)0x111529;
  memleak_start();
  pfStack_918 = (fdb_kvs_handle *)0x111533;
  pfVar10 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_918 = (fdb_kvs_handle *)0x111540;
  srand(0x4d2);
  pfVar17 = (fdb_kvs_handle *)(auStack_880 + 0x108);
  pfStack_918 = (fdb_kvs_handle *)0x111550;
  fdb_get_default_config();
  uStack_758 = 1;
  uStack_760 = '\x01';
  uStack_738 = 1;
  sStack_770 = 0;
  pfStack_918 = (fdb_kvs_handle *)0x111570;
  fdb_get_default_kvs_config();
  pfStack_918 = (fdb_kvs_handle *)0x111584;
  fVar5 = fdb_open(&pfStack_8f0,"./mvcc_test9",(fdb_config *)pfVar17);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a3c;
  in_RCX = (fdb_kvs_handle *)auStack_8a8;
  pfStack_918 = (fdb_kvs_handle *)0x1115a2;
  fVar5 = fdb_kvs_open(pfStack_8f0,&pfStack_900,(char *)0x0,(fdb_kvs_config *)in_RCX);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a41;
  in_RCX = (fdb_kvs_handle *)auStack_8a8;
  pfStack_918 = (fdb_kvs_handle *)0x1115c5;
  fVar5 = fdb_kvs_open(pfStack_8f0,&pfStack_8f8,"db1",(fdb_kvs_config *)in_RCX);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a46;
  in_RCX = (fdb_kvs_handle *)auStack_8a8;
  pfStack_918 = (fdb_kvs_handle *)0x1115e8;
  fVar5 = fdb_kvs_open(pfStack_8f0,&pfStack_908,"db2",(fdb_kvs_config *)in_RCX);
  pcVar23 = (char *)pfVar17;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a4b;
  puStack_8e8 = (undefined4 *)((long)&pfVar10->kvs + 2);
  pcVar23 = "key%06d";
  pcVar19 = auStack_880;
  unaff_R12 = "value%d";
  handle._M_i = 0;
  do {
    pfStack_918 = (fdb_kvs_handle *)0x111623;
    sprintf(pcVar19,"key%06d",handle._M_i);
    *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar10->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_8e8 + 1) = 0x3e;
    *puStack_8e8 = 0x646e653c;
    pfStack_918 = (fdb_kvs_handle *)0x111651;
    sprintf((char *)pfVar10,"value%d",handle._M_i);
    pfVar17 = pfStack_900;
    pfStack_918 = (fdb_kvs_handle *)0x11165e;
    sVar9 = strlen(pcVar19);
    pfStack_918 = (fdb_kvs_handle *)0x111676;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv(pfVar17,pcVar19,sVar9 + 1,pfVar10,0x20);
    pfVar14 = pfStack_8f8;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pfStack_918 = (fdb_kvs_handle *)0x111a28;
      snapshot_with_uncomitted_data_test();
LAB_00111a28:
      unaff_R13 = (char *)pfVar17;
      pfStack_918 = (fdb_kvs_handle *)0x111a2d;
      snapshot_with_uncomitted_data_test();
LAB_00111a2d:
      pfStack_918 = (fdb_kvs_handle *)0x111a32;
      snapshot_with_uncomitted_data_test();
      goto LAB_00111a32;
    }
    pfStack_918 = (fdb_kvs_handle *)0x11168b;
    sVar9 = strlen(pcVar19);
    pfStack_918 = (fdb_kvs_handle *)0x1116a3;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv(pfVar14,pcVar19,sVar9 + 1,pfVar10,0x20);
    unaff_R13 = (char *)pfStack_908;
    pfVar17 = pfVar14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a28;
    pfStack_918 = (fdb_kvs_handle *)0x1116b8;
    sVar9 = strlen(pcVar19);
    pfStack_918 = (fdb_kvs_handle *)0x1116d0;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar19,sVar9 + 1,pfVar10,0x20);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a2d;
    uVar18 = (int)handle._M_i + 1;
    handle._M_i = (__int_type)uVar18;
  } while (uVar18 != 10);
  pfStack_918 = (fdb_kvs_handle *)0x1116f2;
  fVar5 = fdb_get_kvs_info(pfStack_900,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a50;
  pfStack_918 = (fdb_kvs_handle *)0x11170c;
  fVar5 = fdb_snapshot_open(pfStack_900,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a55;
  pfStack_918 = (fdb_kvs_handle *)0x111723;
  fVar5 = fdb_get_kvs_info(pfStack_8f8,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a5a;
  pfStack_918 = (fdb_kvs_handle *)0x11173d;
  fVar5 = fdb_snapshot_open(pfStack_8f8,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a5f;
  pfStack_918 = (fdb_kvs_handle *)0x111754;
  fVar5 = fdb_get_kvs_info(pfStack_908,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a64;
  pfStack_918 = (fdb_kvs_handle *)0x11176e;
  fVar5 = fdb_snapshot_open(pfStack_908,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a69;
  pfStack_918 = (fdb_kvs_handle *)0x111782;
  fVar5 = fdb_commit(pfStack_8f0,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a6e;
  pfStack_918 = (fdb_kvs_handle *)0x111799;
  fVar5 = fdb_get_kvs_info(pfStack_8f8,(fdb_kvs_info *)auStack_8e0);
  pfVar17 = (fdb_kvs_handle *)auStack_8e0._8_8_;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a73;
  pfStack_918 = (fdb_kvs_handle *)0x1117b4;
  fVar5 = fdb_get_kvs_info(pfStack_908,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a78;
  pcVar19 = auStack_8e0 + 8;
  if (pfVar17 != (fdb_kvs_handle *)auStack_8e0._8_8_) {
    pfStack_918 = (fdb_kvs_handle *)0x1117d1;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_918 = (fdb_kvs_handle *)0x1117e0;
  fVar5 = fdb_get_kvs_info(pfStack_900,(fdb_kvs_info *)auStack_8e0);
  pcVar23 = (char *)pfVar17;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a7d;
  if (pfVar17 != (fdb_kvs_handle *)auStack_8e0._8_8_) {
    pfStack_918 = (fdb_kvs_handle *)0x1117fa;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_8b0 = pfVar17;
  pcVar19 = "key%06d";
  unaff_R12 = auStack_880;
  unaff_R13 = "value%d";
  handle._M_i = 0;
  do {
    pfStack_918 = (fdb_kvs_handle *)0x111826;
    sprintf(unaff_R12,"key%06d",handle._M_i);
    *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar10->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
    *(undefined2 *)(puStack_8e8 + 1) = 0x3e;
    *puStack_8e8 = 0x646e653c;
    pfStack_918 = (fdb_kvs_handle *)0x111854;
    sprintf((char *)pfVar10,"value%d",handle._M_i);
    pfVar17 = pfStack_900;
    pfStack_918 = (fdb_kvs_handle *)0x111861;
    sVar9 = strlen(unaff_R12);
    pfStack_918 = (fdb_kvs_handle *)0x111879;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv(pfVar17,unaff_R12,sVar9 + 1,pfVar10,0x20);
    pcVar23 = (char *)pfStack_908;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a37;
    pfStack_918 = (fdb_kvs_handle *)0x11188e;
    sVar9 = strlen(unaff_R12);
    pfStack_918 = (fdb_kvs_handle *)0x1118a6;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv((fdb_kvs_handle *)pcVar23,unaff_R12,sVar9 + 1,pfVar10,0x20);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a32;
    uVar18 = (int)handle._M_i + 1;
    handle._M_i = (__int_type)uVar18;
  } while (uVar18 != 10);
  pfStack_918 = (fdb_kvs_handle *)0x1118c8;
  fVar5 = fdb_get_kvs_info(pfStack_8f8,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a82;
  pfStack_918 = (fdb_kvs_handle *)0x1118e2;
  fVar5 = fdb_snapshot_open(pfStack_8f8,&pfStack_910,auStack_8e0._8_8_);
  pcVar23 = (char *)pfStack_8b0;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a87;
  pfStack_918 = (fdb_kvs_handle *)0x1118f8;
  fVar5 = fdb_kvs_close(pfStack_910);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a8c;
  pfStack_918 = (fdb_kvs_handle *)0x11190f;
  fVar5 = fdb_get_kvs_info(pfStack_908,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a91;
  pfStack_918 = (fdb_kvs_handle *)0x111929;
  fVar5 = fdb_snapshot_open(pfStack_908,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a96;
  pfStack_918 = (fdb_kvs_handle *)0x111941;
  fVar5 = fdb_snapshot_open(pfStack_908,&pfStack_910,(fdb_seqnum_t)pcVar23);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a9b;
  pfStack_918 = (fdb_kvs_handle *)0x111952;
  fVar5 = fdb_kvs_close(pfStack_910);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111aa0;
  pfStack_918 = (fdb_kvs_handle *)0x111969;
  fVar5 = fdb_get_kvs_info(pfStack_900,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111aa5;
  pfStack_918 = (fdb_kvs_handle *)0x111983;
  fVar5 = fdb_snapshot_open(pfStack_900,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111aaa;
  pfStack_918 = (fdb_kvs_handle *)0x11199b;
  fVar5 = fdb_snapshot_open(pfStack_900,&pfStack_910,(fdb_seqnum_t)pcVar23);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111aaf;
  pfStack_918 = (fdb_kvs_handle *)0x1119ac;
  fVar5 = fdb_kvs_close(pfStack_910);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111ab4;
  pfStack_918 = (fdb_kvs_handle *)0x1119be;
  fVar5 = fdb_close(pfStack_8f0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111ab9;
  pfStack_918 = (fdb_kvs_handle *)0x1119cb;
  fVar5 = fdb_shutdown();
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_918 = (fdb_kvs_handle *)0x1119db;
    free(pfVar10);
    pfStack_918 = (fdb_kvs_handle *)0x1119e0;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pfStack_918 = (fdb_kvs_handle *)0x111a11;
    fprintf(_stderr,pcVar19,"snapshot with uncomitted data in other KVS test");
    return;
  }
  goto LAB_00111abe;
LAB_00112f50:
  pfStack_1460 = (fdb_kvs_handle *)0x112f55;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f55:
  pfStack_1460 = (fdb_kvs_handle *)0x112f5a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f5a:
  pfStack_1460 = (fdb_kvs_handle *)0x112f6a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f6a:
  pfStack_1460 = (fdb_kvs_handle *)0x112f75;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f75:
  pfStack_1460 = (fdb_kvs_handle *)0x112f85;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f85:
  pfVar17 = (fdb_kvs_handle *)pcVar19;
  pfStack_1460 = (fdb_kvs_handle *)0x112f8a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f8a:
  pfStack_1460 = (fdb_kvs_handle *)0x112f9a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f9a:
  pfStack_1460 = (fdb_kvs_handle *)0x112fa5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fa5:
  pfStack_1460 = (fdb_kvs_handle *)0x112fb0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fb0:
  pfStack_1460 = (fdb_kvs_handle *)0x112fc0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fc0:
  pfStack_1460 = (fdb_kvs_handle *)0x112fcb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fcb:
  pfStack_1460 = (fdb_kvs_handle *)0x112fd0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd0:
  pfStack_1460 = (fdb_kvs_handle *)0x112fd5;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_00112fd5;
LAB_0011350e:
  pfStack_1878 = (fdb_kvs_handle *)0x11351e;
  in_memory_snapshot_compaction_test();
LAB_0011351e:
  pfStack_1878 = (fdb_kvs_handle *)0x113529;
  in_memory_snapshot_compaction_test();
LAB_00113529:
  pfStack_1878 = (fdb_kvs_handle *)0x113539;
  in_memory_snapshot_compaction_test();
LAB_00113539:
  pfStack_1878 = (fdb_kvs_handle *)0x113544;
  in_memory_snapshot_compaction_test();
  goto LAB_00113544;
LAB_00113a98:
  pcStack_1b30 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_1b30 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_1b30 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar17 = (fdb_kvs_handle *)afStack_19a8;
  unaff_R12 = auStack_1aae + 6;
  pcStack_1b30 = (code *)0x113ad8;
  cb_inmem_snap();
  goto LAB_00113ad8;
LAB_0011456a:
  pfStack_20a8 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar15 = pfVar10;
LAB_00114575:
  pfVar10 = pfVar15;
  pfStack_20a8 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_20a8 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar17 = (fdb_kvs_handle *)&pfStack_2090;
  pfStack_20a8 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_00111a32:
  pfStack_918 = (fdb_kvs_handle *)0x111a37;
  snapshot_with_uncomitted_data_test();
  pfVar17 = (fdb_kvs_handle *)pcVar23;
LAB_00111a37:
  pfStack_918 = (fdb_kvs_handle *)0x111a3c;
  snapshot_with_uncomitted_data_test();
LAB_00111a3c:
  pfStack_918 = (fdb_kvs_handle *)0x111a41;
  snapshot_with_uncomitted_data_test();
LAB_00111a41:
  pfStack_918 = (fdb_kvs_handle *)0x111a46;
  snapshot_with_uncomitted_data_test();
LAB_00111a46:
  pfStack_918 = (fdb_kvs_handle *)0x111a4b;
  snapshot_with_uncomitted_data_test();
  pcVar23 = (char *)pfVar17;
LAB_00111a4b:
  pfStack_918 = (fdb_kvs_handle *)0x111a50;
  snapshot_with_uncomitted_data_test();
LAB_00111a50:
  pfStack_918 = (fdb_kvs_handle *)0x111a55;
  snapshot_with_uncomitted_data_test();
LAB_00111a55:
  pfStack_918 = (fdb_kvs_handle *)0x111a5a;
  snapshot_with_uncomitted_data_test();
LAB_00111a5a:
  pfStack_918 = (fdb_kvs_handle *)0x111a5f;
  snapshot_with_uncomitted_data_test();
LAB_00111a5f:
  pfStack_918 = (fdb_kvs_handle *)0x111a64;
  snapshot_with_uncomitted_data_test();
LAB_00111a64:
  pfStack_918 = (fdb_kvs_handle *)0x111a69;
  snapshot_with_uncomitted_data_test();
LAB_00111a69:
  pfStack_918 = (fdb_kvs_handle *)0x111a6e;
  snapshot_with_uncomitted_data_test();
LAB_00111a6e:
  pfStack_918 = (fdb_kvs_handle *)0x111a73;
  snapshot_with_uncomitted_data_test();
LAB_00111a73:
  pfVar17 = (fdb_kvs_handle *)pcVar23;
  pfStack_918 = (fdb_kvs_handle *)0x111a78;
  snapshot_with_uncomitted_data_test();
LAB_00111a78:
  pfStack_918 = (fdb_kvs_handle *)0x111a7d;
  snapshot_with_uncomitted_data_test();
  pcVar23 = (char *)pfVar17;
LAB_00111a7d:
  pfStack_918 = (fdb_kvs_handle *)0x111a82;
  snapshot_with_uncomitted_data_test();
LAB_00111a82:
  pfStack_918 = (fdb_kvs_handle *)0x111a87;
  snapshot_with_uncomitted_data_test();
LAB_00111a87:
  pfStack_918 = (fdb_kvs_handle *)0x111a8c;
  snapshot_with_uncomitted_data_test();
LAB_00111a8c:
  pfStack_918 = (fdb_kvs_handle *)0x111a91;
  snapshot_with_uncomitted_data_test();
LAB_00111a91:
  pfStack_918 = (fdb_kvs_handle *)0x111a96;
  snapshot_with_uncomitted_data_test();
LAB_00111a96:
  pfStack_918 = (fdb_kvs_handle *)0x111a9b;
  snapshot_with_uncomitted_data_test();
LAB_00111a9b:
  pfStack_918 = (fdb_kvs_handle *)0x111aa0;
  snapshot_with_uncomitted_data_test();
LAB_00111aa0:
  pfStack_918 = (fdb_kvs_handle *)0x111aa5;
  snapshot_with_uncomitted_data_test();
LAB_00111aa5:
  pfStack_918 = (fdb_kvs_handle *)0x111aaa;
  snapshot_with_uncomitted_data_test();
LAB_00111aaa:
  pfStack_918 = (fdb_kvs_handle *)0x111aaf;
  snapshot_with_uncomitted_data_test();
LAB_00111aaf:
  pfStack_918 = (fdb_kvs_handle *)0x111ab4;
  snapshot_with_uncomitted_data_test();
LAB_00111ab4:
  pfStack_918 = (fdb_kvs_handle *)0x111ab9;
  snapshot_with_uncomitted_data_test();
LAB_00111ab9:
  pfStack_918 = (fdb_kvs_handle *)0x111abe;
  snapshot_with_uncomitted_data_test();
LAB_00111abe:
  pfStack_918 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae3;
  pfStack_940 = pfVar10;
  pfStack_938 = (fdb_kvs_handle *)unaff_R12;
  pfStack_930 = (fdb_kvs_handle *)unaff_R13;
  pfStack_928 = (fdb_kvs_handle *)pcVar23;
  pfStack_920 = (fdb_kvs_handle *)pcVar19;
  pfStack_918 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_de8 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae8;
  memleak_start();
  pcVar23 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111af7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar8 = &fStack_a38;
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b07;
  fdb_get_default_config();
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b11;
  fdb_get_default_kvs_config();
  fStack_a38.buffercache_size = 0;
  fStack_a38.wal_threshold = 0x400;
  fStack_a38.flags = 1;
  fStack_a38.compaction_threshold = '\0';
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b36;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b4a;
  fVar5 = fdb_open(&pfStack_e50,"./mvcc_test1",pfVar8);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b66;
    fVar5 = fdb_kvs_open_default(pfStack_e50,&pfStack_e60,&fStack_e00);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011224b;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b7f;
    fVar5 = fdb_snapshot_open(pfStack_e60,&pfStack_e58,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112250;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b96;
    fdb_get_kvs_info(pfStack_e58,&fStack_e30);
    if ((fdb_config *)fStack_e30.last_seqnum != (fdb_config *)0x0) {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ba6;
      in_memory_snapshot_test();
    }
    pcVar23 = auStack_e48;
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bc9;
    fdb_iterator_init(pfStack_e58,(fdb_iterator **)pcVar23,(void *)0x0,0,(void *)0x0,0,0);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bd6;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_e48._0_8_,(fdb_doc **)(auStack_e48 + 8));
    _Var13._M_i = (__int_type)pfVar8;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112255;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111be9;
    fdb_iterator_close((fdb_iterator *)auStack_e48._0_8_);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf3;
    fdb_kvs_close(pfStack_e58);
    lVar22 = 0;
    uVar16 = 0;
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
      sprintf(acStack_d38,"key%d",uVar16 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c31;
      sprintf(auStack_c38,"meta%d",uVar16 & 0xffffffff);
      pcVar19 = auStack_c38 + 0x100;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c4d;
      sprintf(pcVar19,"body%d",uVar16 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c60;
      sVar9 = strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c6b;
      sVar11 = strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c76;
      sVar12 = strlen(pcVar19);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c9b;
      fdb_doc_create((fdb_doc **)(auStack_de8 + lVar22),acStack_d38,sVar9,auStack_c38,sVar11,pcVar19
                     ,sVar12);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cad;
      fdb_set(pfStack_e60,*(fdb_doc **)(auStack_de8 + uVar16 * 8));
      uVar16 = uVar16 + 1;
      lVar22 = lVar22 + 8;
    } while (uVar16 != 5);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ccd;
    fdb_commit(pfStack_e50,'\x01');
    uVar16 = 5;
    ppfVar24 = (fdb_doc **)(auStack_de8 + 0x28);
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
      sprintf(acStack_d38,"key%d",uVar16 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d13;
      sprintf(auStack_c38,"meta%d",uVar16 & 0xffffffff);
      pcVar19 = auStack_c38 + 0x100;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d2f;
      sprintf(pcVar19,"body%d",uVar16 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d37;
      sVar9 = strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d42;
      sVar11 = strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d4d;
      sVar12 = strlen(pcVar19);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6d;
      fdb_doc_create(ppfVar24,acStack_d38,sVar9,auStack_c38,sVar11,pcVar19,sVar12);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d7a;
      fdb_set(pfStack_e60,*ppfVar24);
      uVar16 = uVar16 + 1;
      ppfVar24 = ppfVar24 + 1;
    } while (uVar16 != 9);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
    sprintf(acStack_d38,"key%d",9);
    pcVar19 = auStack_c38;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dc7;
    sprintf(pcVar19,"meta%d",9);
    unaff_R12 = auStack_c38 + 0x100;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111de5;
    sprintf(unaff_R12,"Body%d",9);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111df5;
    unaff_R13 = (char *)strlen(acStack_d38);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e00;
    handle._M_i = strlen(pcVar19);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e0b;
    sVar9 = strlen(unaff_R12);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e26;
    in_RCX = (fdb_kvs_handle *)pcVar19;
    fdb_doc_create((fdb_doc **)(auStack_de8 + 0x48),acStack_d38,(size_t)unaff_R13,pcVar19,
                   handle._M_i,unaff_R12,sVar9);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e33;
    fdb_set(pfStack_e60,(fdb_doc *)auStack_de8._72_8_);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3f;
    fdb_commit(pfStack_e50,'\0');
    **(undefined1 **)(auStack_de8._72_8_ + 0x40) = 0x62;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e56;
    fdb_set(pfStack_e60,(fdb_doc *)auStack_de8._72_8_);
    _Var13._M_i = *(fdb_seqnum_t *)(auStack_de8._72_8_ + 0x28);
    pcVar23 = (char *)&fStack_e30;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e6f;
    fdb_get_kvs_info(pfStack_e60,(fdb_kvs_info *)pcVar23);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e82;
    fVar5 = fdb_snapshot_open(pfStack_e60,&pfStack_e58,fStack_e30.last_seqnum);
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0011225a;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ea6;
    pfStack_e38 = (fdb_config *)_Var13._M_i;
    fVar5 = fdb_snapshot_open(pfStack_e60,&pfStack_e58,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011225f;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eba;
    fdb_commit(pfStack_e50,'\0');
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ecc;
    fdb_set(pfStack_e60,(fdb_doc *)auStack_de8._72_8_);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed8;
    fdb_commit(pfStack_e50,'\0');
    uVar16 = 10;
    pcVar23 = (char *)0x50;
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eff;
      sprintf(acStack_d38,"key%d",uVar16 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f1b;
      sprintf(auStack_c38,"meta%d",uVar16 & 0xffffffff);
      unaff_R12 = auStack_c38 + 0x100;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f37;
      sprintf(unaff_R12,"body%d",uVar16 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_de8 + (long)pcVar23);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4a;
      _Var13._M_i = strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f55;
      unaff_R13 = (char *)strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f60;
      sVar9 = strlen(unaff_R12);
      in_RCX = (fdb_kvs_handle *)auStack_c38;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f85;
      fdb_doc_create((fdb_doc **)handle._M_i,acStack_d38,_Var13._M_i,in_RCX,(size_t)unaff_R13,
                     unaff_R12,sVar9);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f97;
      fdb_set(pfStack_e60,*(fdb_doc **)(auStack_de8 + uVar16 * 8));
      uVar16 = uVar16 + 1;
      pcVar23 = (char *)((long)pcVar23 + 8);
    } while (uVar16 != 0xf);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc0;
    fVar5 = fdb_set_log_callback(pfStack_e60,logCallbackFunc,"in_memory_snapshot_test");
    pcVar19 = (char *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112264;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_get_kvs_info(pfStack_e58,&fStack_e30);
    if ((fdb_config *)fStack_e30.last_seqnum != pfStack_e38) {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fef;
      in_memory_snapshot_test();
    }
    uVar16 = 0xf;
    pfVar8 = (fdb_config *)(auStack_de8 + 0x78);
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112017;
      sprintf(acStack_d38,"key%d",uVar16 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112032;
      sprintf(auStack_c38,"meta%d",uVar16 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_c38 + 0x100);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11204d;
      sprintf((char *)handle._M_i,"body%d",uVar16 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112055;
      pcVar19 = (char *)strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112060;
      unaff_R12 = (char *)strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206b;
      sVar9 = strlen((char *)handle._M_i);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11208b;
      fdb_doc_create((fdb_doc **)pfVar8,acStack_d38,(size_t)pcVar19,auStack_c38,(size_t)unaff_R12,
                     (void *)handle._M_i,sVar9);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112098;
      fdb_set(pfStack_e60,*(fdb_doc **)pfVar8);
      uVar16 = uVar16 + 1;
      pfVar8 = (fdb_config *)((long)pfVar8 + 8);
    } while (uVar16 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120b8;
    fdb_commit(pfStack_e50,'\0');
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120d8;
    fdb_iterator_init(pfStack_e58,(fdb_iterator **)auStack_e48,(void *)0x0,0,(void *)0x0,0,0);
    pcVar23 = auStack_e48 + 8;
    auStack_e48._8_8_ = (fdb_config *)0x0;
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120f1;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_e48._0_8_,(fdb_doc **)pcVar23);
      _Var13._M_i = auStack_e48._8_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_0011222b:
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112230;
        in_memory_snapshot_test();
LAB_00112230:
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11223b;
        in_memory_snapshot_test();
LAB_0011223b:
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112246;
        in_memory_snapshot_test();
        goto LAB_00112246;
      }
      pcVar19 = *(char **)(auStack_e48._8_8_ + 0x20);
      handle._M_i = *(__int_type *)(auStack_de8 + (long)unaff_R13 * 8);
      unaff_R12 = (char *)((fdb_kvs_handle *)handle._M_i)->op_stats;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11211c;
      iVar6 = bcmp(pcVar19,unaff_R12,*(size_t *)auStack_e48._8_8_);
      pfVar8 = (fdb_config *)_Var13._M_i;
      if (iVar6 != 0) {
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222b;
        in_memory_snapshot_test();
        goto LAB_0011222b;
      }
      pcVar19 = *(char **)(_Var13._M_i + 0x38);
      unaff_R12 = (char *)((fdb_kvs_handle *)handle._M_i)->staletree;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11213b;
      iVar6 = bcmp(pcVar19,unaff_R12,*(uint64_t *)(_Var13._M_i + 8));
      if (iVar6 != 0) goto LAB_0011223b;
      pcVar19 = *(char **)(_Var13._M_i + 0x40);
      unaff_R12 = (char *)(((fdb_kvs_handle *)handle._M_i)->field_6).seqtree;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215a;
      iVar6 = bcmp(pcVar19,unaff_R12,*(uint64_t *)(_Var13._M_i + 0x10));
      if (iVar6 != 0) goto LAB_00112230;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216a;
      fdb_doc_free((fdb_doc *)_Var13._M_i);
      auStack_e48._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112180;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_e48._0_8_);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11219d;
      fdb_iterator_close((fdb_iterator *)auStack_e48._0_8_);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a7;
      fdb_kvs_close(pfStack_e60);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121b1;
      fdb_kvs_close(pfStack_e58);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121bb;
      fdb_close(pfStack_e50);
      lVar22 = 0;
      do {
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ca;
        fdb_doc_free(*(fdb_doc **)(auStack_de8 + lVar22 * 8));
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x14);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121d8;
      fdb_shutdown();
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121dd;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11220e;
      fprintf(_stderr,pcVar19,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112246:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11224b;
    in_memory_snapshot_test();
LAB_0011224b:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112250;
    in_memory_snapshot_test();
LAB_00112250:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112255;
    in_memory_snapshot_test();
    _Var13._M_i = (__int_type)pfVar8;
LAB_00112255:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225a;
    in_memory_snapshot_test();
LAB_0011225a:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225f;
    in_memory_snapshot_test();
LAB_0011225f:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112264;
    in_memory_snapshot_test();
LAB_00112264:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112269;
    in_memory_snapshot_test();
  }
  aStack_e70.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle_00 = (char *)0x0;
  pfStack_1098 = (fdb_kvs_handle *)0x112291;
  pfStack_e98 = (fdb_kvs_info *)pcVar23;
  aStack_e90.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_R12;
  pfStack_e88 = (fdb_kvs_handle *)unaff_R13;
  aStack_e80.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
  pfStack_e78 = (fdb_kvs_handle *)pcVar19;
  aStack_e70.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  gettimeofday(&tStack_fc0,(__timezone_ptr_t)0x0);
  pfStack_1098 = (fdb_kvs_handle *)0x112296;
  memleak_start();
  aStack_1078.seqtree = (btree *)0x0;
  pcVar19 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_1098 = (fdb_kvs_handle *)0x1122aa;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)&fStack_fb0.seqtree_opt;
  pfStack_1098 = (fdb_kvs_handle *)0x1122ba;
  fdb_get_default_config();
  pfStack_1098 = (fdb_kvs_handle *)0x1122c4;
  fdb_get_default_kvs_config();
  fStack_fb0.compaction_minimum_filesize = 0x400;
  fStack_fb0._68_4_ = 1;
  fStack_fb0.prefetch_duration._7_1_ = '\0';
  fStack_fb0.breakpad_minidump_dir = (char *)0x0;
  pfStack_1098 = (fdb_kvs_handle *)0x1122e8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1098 = (fdb_kvs_handle *)0x1122fc;
  fVar5 = fdb_open(&pfStack_1080,"./mvcc_test1",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1098 = (fdb_kvs_handle *)0x112318;
    fVar5 = fdb_kvs_open_default(pfStack_1080,&pfStack_1088,&fStack_1038);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126ac;
    pfStack_1098 = (fdb_kvs_handle *)0x112338;
    fVar5 = fdb_set_log_callback(pfStack_1088,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126b1;
    pcVar19 = (char *)aaStack_fe0;
    aaStack_fe0[0]._0_4_ = 0x79656b;
    pfVar17 = (fdb_kvs_handle *)&fStack_1000;
    fStack_1000._4_1_ = 0;
    fStack_1000.create_if_missing = true;
    fStack_1000._1_3_ = 0x617465;
    handle_00 = &fStack_1020.create_if_missing;
    fStack_1020._4_1_ = 0;
    fStack_1020.create_if_missing = true;
    fStack_1020._1_3_ = 0x79646f;
    pfStack_1098 = (fdb_kvs_handle *)0x11237b;
    unaff_R12 = (char *)strlen(pcVar19);
    pfStack_1098 = (fdb_kvs_handle *)0x112386;
    unaff_R13 = (char *)strlen((char *)pfVar17);
    pfStack_1098 = (fdb_kvs_handle *)0x112391;
    sVar9 = strlen(handle_00);
    handle._M_i = (__int_type)&aStack_1078;
    pfStack_1098 = (fdb_kvs_handle *)0x1123b1;
    in_RCX = pfVar17;
    fdb_doc_create((fdb_doc **)handle._M_i,pcVar19,(size_t)unaff_R12,pfVar17,(size_t)unaff_R13,
                   handle_00,sVar9);
    pfStack_1098 = (fdb_kvs_handle *)0x1123bf;
    fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    pfStack_1098 = (fdb_kvs_handle *)0x1123cb;
    fdb_commit(pfStack_1080,'\0');
    pfStack_1098 = (fdb_kvs_handle *)0x1123e1;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1058,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126b6;
    pfStack_1098 = (fdb_kvs_handle *)0x1123f8;
    fVar5 = fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126bb;
    pfStack_1098 = (fdb_kvs_handle *)0x11240c;
    fVar5 = fdb_commit(pfStack_1080,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126c0;
    pfStack_1098 = (fdb_kvs_handle *)0x11242a;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1060,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126c5;
    pfStack_1098 = (fdb_kvs_handle *)0x112441;
    fVar5 = fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126ca;
    pfStack_1098 = (fdb_kvs_handle *)0x112455;
    fVar5 = fdb_commit(pfStack_1080,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126cf;
    pfStack_1098 = (fdb_kvs_handle *)0x11246c;
    fVar5 = fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126d4;
    pfStack_1098 = (fdb_kvs_handle *)0x112480;
    fVar5 = fdb_commit(pfStack_1080,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126d9;
    pcVar19 = (char *)&aStack_1078;
    pfStack_1098 = (fdb_kvs_handle *)0x112495;
    fdb_doc_free((fdb_doc *)aStack_1078.seqtree);
    pfVar17 = (fdb_kvs_handle *)&fStack_fb0;
    fStack_fb0.chunksize = 0x654b;
    fStack_fb0._2_2_ = 0x79;
    pfStack_1098 = (fdb_kvs_handle *)0x1124ac;
    handle_00 = (char *)strlen((char *)pfVar17);
    unaff_R12 = &fStack_1000.create_if_missing;
    pfStack_1098 = (fdb_kvs_handle *)0x1124bf;
    unaff_R13 = (char *)strlen(unaff_R12);
    handle._M_i = (__int_type)&fStack_1020;
    pfStack_1098 = (fdb_kvs_handle *)0x1124cf;
    sVar9 = strlen((char *)handle._M_i);
    pfStack_1098 = (fdb_kvs_handle *)0x1124ea;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar19,pfVar17,(size_t)handle_00,unaff_R12,(size_t)unaff_R13,
                   (void *)handle._M_i,sVar9);
    pfStack_1098 = (fdb_kvs_handle *)0x1124f7;
    fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    pfStack_1098 = (fdb_kvs_handle *)0x11250d;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1068,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126de;
    pcVar19 = (char *)aaStack_fe0;
    pfStack_1098 = (fdb_kvs_handle *)0x112525;
    sVar9 = strlen(pcVar19);
    pfVar17 = (fdb_kvs_handle *)&pfStack_1070;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1098 = (fdb_kvs_handle *)0x112548;
    fdb_doc_create((fdb_doc **)pfVar17,pcVar19,sVar9,(void *)0x0,0,(void *)0x0,0);
    pfStack_1098 = (fdb_kvs_handle *)0x112555;
    fVar5 = fdb_get(pfStack_1058,pfStack_1070);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126e3;
    pfStack_1098 = (fdb_kvs_handle *)0x11256c;
    fVar5 = fdb_get(pfStack_1060,pfStack_1070);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126e8;
    pfStack_1098 = (fdb_kvs_handle *)0x112583;
    fVar5 = fdb_get(pfStack_1068,pfStack_1070);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126ed;
    pfStack_1098 = (fdb_kvs_handle *)0x112595;
    fdb_doc_free(pfStack_1070);
    pfStack_1098 = (fdb_kvs_handle *)0x1125a9;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1040,1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126f2;
    pfStack_1098 = (fdb_kvs_handle *)0x1125c5;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1048,2);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126f7;
    pfStack_1098 = (fdb_kvs_handle *)0x1125e1;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1050,3);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126fc;
    pfStack_1098 = (fdb_kvs_handle *)0x1125f3;
    fdb_kvs_close(pfStack_1058);
    pfStack_1098 = (fdb_kvs_handle *)0x1125fd;
    fdb_kvs_close(pfStack_1060);
    pfStack_1098 = (fdb_kvs_handle *)0x112607;
    fdb_kvs_close(pfStack_1068);
    pfStack_1098 = (fdb_kvs_handle *)0x112616;
    fVar5 = fdb_commit(pfStack_1080,'\x01');
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1098 = (fdb_kvs_handle *)0x112628;
      fdb_kvs_close(pfStack_1040);
      pfStack_1098 = (fdb_kvs_handle *)0x112632;
      fdb_kvs_close(pfStack_1048);
      pfStack_1098 = (fdb_kvs_handle *)0x11263c;
      fdb_kvs_close(pfStack_1050);
      pfStack_1098 = (fdb_kvs_handle *)0x112646;
      fdb_kvs_close(pfStack_1088);
      pfStack_1098 = (fdb_kvs_handle *)0x112650;
      fdb_close(pfStack_1080);
      pfStack_1098 = (fdb_kvs_handle *)0x11265a;
      fdb_doc_free((fdb_doc *)aStack_1078.seqtree);
      pfStack_1098 = (fdb_kvs_handle *)0x11265f;
      fdb_shutdown();
      pfStack_1098 = (fdb_kvs_handle *)0x112664;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1098 = (fdb_kvs_handle *)0x112695;
      fprintf(_stderr,pcVar19,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_1098 = (fdb_kvs_handle *)0x1126ac;
    in_memory_snapshot_cleanup_test();
LAB_001126ac:
    pfStack_1098 = (fdb_kvs_handle *)0x1126b1;
    in_memory_snapshot_cleanup_test();
LAB_001126b1:
    pfStack_1098 = (fdb_kvs_handle *)0x1126b6;
    in_memory_snapshot_cleanup_test();
LAB_001126b6:
    pfStack_1098 = (fdb_kvs_handle *)0x1126bb;
    in_memory_snapshot_cleanup_test();
LAB_001126bb:
    pfStack_1098 = (fdb_kvs_handle *)0x1126c0;
    in_memory_snapshot_cleanup_test();
LAB_001126c0:
    pfStack_1098 = (fdb_kvs_handle *)0x1126c5;
    in_memory_snapshot_cleanup_test();
LAB_001126c5:
    pfStack_1098 = (fdb_kvs_handle *)0x1126ca;
    in_memory_snapshot_cleanup_test();
LAB_001126ca:
    pfStack_1098 = (fdb_kvs_handle *)0x1126cf;
    in_memory_snapshot_cleanup_test();
LAB_001126cf:
    pfStack_1098 = (fdb_kvs_handle *)0x1126d4;
    in_memory_snapshot_cleanup_test();
LAB_001126d4:
    pfStack_1098 = (fdb_kvs_handle *)0x1126d9;
    in_memory_snapshot_cleanup_test();
LAB_001126d9:
    pfStack_1098 = (fdb_kvs_handle *)0x1126de;
    in_memory_snapshot_cleanup_test();
LAB_001126de:
    pfStack_1098 = (fdb_kvs_handle *)0x1126e3;
    in_memory_snapshot_cleanup_test();
LAB_001126e3:
    pfStack_1098 = (fdb_kvs_handle *)0x1126e8;
    in_memory_snapshot_cleanup_test();
LAB_001126e8:
    pfStack_1098 = (fdb_kvs_handle *)0x1126ed;
    in_memory_snapshot_cleanup_test();
LAB_001126ed:
    pfStack_1098 = (fdb_kvs_handle *)0x1126f2;
    in_memory_snapshot_cleanup_test();
LAB_001126f2:
    pfStack_1098 = (fdb_kvs_handle *)0x1126f7;
    in_memory_snapshot_cleanup_test();
LAB_001126f7:
    pfStack_1098 = (fdb_kvs_handle *)0x1126fc;
    in_memory_snapshot_cleanup_test();
LAB_001126fc:
    pfStack_1098 = (fdb_kvs_handle *)0x112701;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_1098 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_1460 = (fdb_kvs_handle *)0x112726;
  paStack_10c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar19;
  pfStack_10b8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_10b0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_10a8 = pfVar17;
  pfStack_10a0 = (fdb_kvs_handle *)handle_00;
  pfStack_1098 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_13d8,(__timezone_ptr_t)0x0);
  pfStack_11c8 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_11c0,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1460 = (fdb_kvs_handle *)0x11274e;
  system((char *)&pfStack_11c8);
  pfStack_1460 = (fdb_kvs_handle *)0x112753;
  memleak_start();
  pfStack_1460 = (fdb_kvs_handle *)0x11275d;
  pfVar10 = (fdb_kvs_handle *)malloc(0x20);
  pfVar17 = (fdb_kvs_handle *)(auStack_13c8 + 0x108);
  pfStack_1460 = (fdb_kvs_handle *)0x112770;
  fdb_get_default_config();
  uStack_12a0._0_1_ = true;
  uStack_12a0._1_1_ = true;
  uStack_12a8 = '\x01';
  pcStack_12b0 = (char *)0x3c;
  uStack_1280 = 1;
  sStack_12b8 = 0;
  pfStack_1460 = (fdb_kvs_handle *)0x11279b;
  fdb_get_default_kvs_config();
  pfStack_1460 = (fdb_kvs_handle *)0x1127af;
  fVar5 = fdb_open(&pfStack_1410,"./mvcc_test",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_13f8 + 8);
    pfStack_1460 = (fdb_kvs_handle *)0x1127d2;
    fVar5 = fdb_kvs_open(pfStack_1410,&pfStack_1428,"db",(fdb_kvs_config *)in_RCX);
    pcVar19 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fda;
    puStack_1430 = (undefined4 *)((long)&pfVar10->kvs + 2);
    pcVar19 = "k%05d";
    handle_00 = auStack_13c8;
    unaff_R12 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1460 = (fdb_kvs_handle *)0x11280d;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar10->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x11283b;
      sprintf((char *)pfVar10,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1428;
      pfStack_1460 = (fdb_kvs_handle *)0x112848;
      sVar9 = strlen(handle_00);
      pfStack_1460 = (fdb_kvs_handle *)0x112860;
      in_RCX = pfVar10;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar9 + 1,pfVar10,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112f50;
      uVar18 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar18;
    } while (uVar18 != 0x1e);
    pfStack_1460 = (fdb_kvs_handle *)0x11287e;
    fVar5 = fdb_commit(pfStack_1410,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fdf;
    pfStack_1460 = (fdb_kvs_handle *)0x11289c;
    fVar5 = fdb_snapshot_open(pfStack_1428,&pfStack_1438,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fe4;
    pfStack_1460 = (fdb_kvs_handle *)0x1128ba;
    fVar5 = fdb_snapshot_open(pfStack_1438,&pfStack_1420,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fe9;
    handle._M_i = 0x1e;
    pcVar19 = "k%05d";
    handle_00 = auStack_13c8;
    unaff_R12 = "value%08d";
    do {
      pfStack_1460 = (fdb_kvs_handle *)0x1128ec;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar10->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x11291a;
      sprintf((char *)pfVar10,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1428;
      pfStack_1460 = (fdb_kvs_handle *)0x112927;
      sVar9 = strlen(handle_00);
      pfStack_1460 = (fdb_kvs_handle *)0x11293f;
      in_RCX = pfVar10;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar9 + 1,pfVar10,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112f55;
      uVar18 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar18;
    } while (uVar18 != 300);
    pfStack_1460 = (fdb_kvs_handle *)0x11296f;
    sprintf((char *)auStack_13c8,"k%05d",0x1e);
    handle_00 = (char *)pfStack_1438;
    pfStack_1460 = (fdb_kvs_handle *)0x11297c;
    sVar9 = strlen((char *)auStack_13c8);
    in_RCX = (fdb_kvs_handle *)auStack_13f8;
    pfStack_1460 = (fdb_kvs_handle *)0x112995;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)handle_00,(fdb_kvs_handle *)auStack_13c8,sVar9 + 1,
                       (void **)in_RCX,&sStack_1400);
    pcVar19 = (char *)pfStack_1420;
    pfVar17 = (fdb_kvs_handle *)auStack_13c8;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00112fee;
    handle_00 = auStack_13c8;
    pfStack_1460 = (fdb_kvs_handle *)0x1129b2;
    sVar9 = strlen(handle_00);
    in_RCX = (fdb_kvs_handle *)auStack_13f8;
    pfStack_1460 = (fdb_kvs_handle *)0x1129cb;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)pcVar19,handle_00,sVar9 + 1,(void **)in_RCX,&sStack_1400);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00112ff3;
    pfStack_1460 = (fdb_kvs_handle *)0x1129dd;
    fVar5 = fdb_kvs_close(pfStack_1438);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112ff8;
    pfStack_1460 = (fdb_kvs_handle *)0x1129ef;
    fVar5 = fdb_kvs_close(pfStack_1420);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112ffd;
    pfStack_1460 = (fdb_kvs_handle *)0x112a0d;
    fVar5 = fdb_snapshot_open(pfStack_1428,&pfStack_1438,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113002;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112a35;
    fVar5 = fdb_iterator_init(pfStack_1438,&pfStack_1440,(void *)0x0,0,(void *)0x0,0,0);
    pfVar17 = (fdb_kvs_handle *)pcVar19;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113007;
    unaff_R12 = auStack_13c8;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1450 = (fdb_kvs_handle *)0x0;
      pfStack_1460 = (fdb_kvs_handle *)0x112a66;
      fVar5 = fdb_iterator_get(pfStack_1440,(fdb_doc **)&pfStack_1450);
      pfVar17 = (fdb_kvs_handle *)pcVar19;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1460 = (fdb_kvs_handle *)0x112a81;
      sprintf(unaff_R12,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar10->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x112aaf;
      sprintf((char *)pfVar10,"value%08d",handle._M_i);
      pcVar19 = (char *)pfStack_1450;
      handle_00 = (char *)pfStack_1450->op_stats;
      pfStack_1460 = (fdb_kvs_handle *)0x112ac6;
      iVar6 = bcmp(handle_00,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
      if (iVar6 != 0) goto LAB_00112f5a;
      handle_00 = (char *)(((fdb_kvs_handle *)pcVar19)->field_6).seqtree;
      pfStack_1460 = (fdb_kvs_handle *)0x112ae1;
      iVar6 = bcmp(handle_00,pfVar10,
                   (size_t)(((fdb_kvs_handle *)pcVar19)->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00112f6a;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_1460 = (fdb_kvs_handle *)0x112af3;
      fdb_doc_free((fdb_doc *)pcVar19);
      pfStack_1460 = (fdb_kvs_handle *)0x112afd;
      fVar5 = fdb_iterator_next(pfStack_1440);
      pfVar17 = (fdb_kvs_handle *)pcVar19;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_0011300c;
    pfStack_1460 = (fdb_kvs_handle *)0x112b1b;
    fVar5 = fdb_iterator_close(pfStack_1440);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113011;
    pfStack_1460 = (fdb_kvs_handle *)0x112b39;
    fVar5 = fdb_snapshot_open(pfStack_1438,&pfStack_1420,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113016;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112b61;
    fVar5 = fdb_iterator_init(pfStack_1438,&pfStack_1440,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011301b;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112b89;
    fVar5 = fdb_iterator_init(pfStack_1420,&pfStack_1408,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113020;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112bb1;
    fVar5 = fdb_iterator_init(pfStack_1428,&pfStack_1418,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113025;
    unaff_R12 = auStack_13c8;
    unaff_R13 = "value%08d";
    handle_00 = "k%06d";
    uStack_1444 = 0;
    do {
      pfStack_1450 = (fdb_kvs_handle *)0x0;
      pfStack_1460 = (fdb_kvs_handle *)0x112bef;
      fVar5 = fdb_iterator_get(pfStack_1440,(fdb_doc **)&pfStack_1450);
      uVar18 = uStack_1444;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1460 = (fdb_kvs_handle *)0x112c0e;
      sprintf(unaff_R12,"k%05d",(ulong)uStack_1444);
      *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar10->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x112c3c;
      sprintf((char *)pfVar10,"value%08d",(ulong)uVar18);
      pcVar19 = (char *)pfStack_1450;
      handle._M_i = (__int_type)pfStack_1450->op_stats;
      pfStack_1460 = (fdb_kvs_handle *)0x112c53;
      iVar6 = bcmp((void *)handle._M_i,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
      if (iVar6 != 0) goto LAB_00112f75;
      handle._M_i = (__int_type)(((fdb_kvs_handle *)pcVar19)->field_6).seqtree;
      pfStack_1460 = (fdb_kvs_handle *)0x112c6e;
      iVar6 = bcmp((void *)handle._M_i,pfVar10,
                   (size_t)(((fdb_kvs_handle *)pcVar19)->kvs_config).custom_cmp_param);
      pfVar17 = (fdb_kvs_handle *)pcVar19;
      if (iVar6 != 0) goto LAB_00112fa5;
      pfStack_1460 = (fdb_kvs_handle *)0x112c7e;
      fdb_doc_free((fdb_doc *)pcVar19);
      pfStack_1450 = (fdb_kvs_handle *)0x0;
      pfStack_1460 = (fdb_kvs_handle *)0x112c96;
      fVar5 = fdb_iterator_get(pfStack_1440,(fdb_doc **)&pfStack_1450);
      pfVar17 = pfStack_1450;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112f85;
      handle._M_i = (__int_type)pfStack_1450->op_stats;
      pfStack_1460 = (fdb_kvs_handle *)0x112cb5;
      iVar6 = bcmp((void *)handle._M_i,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
      if (iVar6 != 0) goto LAB_00112f8a;
      handle._M_i = (__int_type)(pfVar17->field_6).seqtree;
      pfStack_1460 = (fdb_kvs_handle *)0x112cd0;
      iVar6 = bcmp((void *)handle._M_i,pfVar10,(size_t)(pfVar17->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00112f9a;
      uVar18 = uStack_1444 + 1;
      handle._M_i = (__int_type)uVar18;
      pfStack_1460 = (fdb_kvs_handle *)0x112ce6;
      fdb_doc_free((fdb_doc *)pfVar17);
      uStack_1444 = uVar18;
      if (uVar18 == 0x3c) {
        pcVar19 = (char *)0x0;
        do {
          pfStack_1460 = (fdb_kvs_handle *)0x112d02;
          sprintf(unaff_R12,"k%06d",pcVar19);
          *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
          *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
          *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
          *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
          *(undefined4 *)&pfVar10->kvs = 0x78787878;
          *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
          *(undefined2 *)(puStack_1430 + 1) = 0x3e;
          *puStack_1430 = 0x646e653c;
          pfStack_1460 = (fdb_kvs_handle *)0x112d31;
          sprintf((char *)pfVar10,"value%08d",pcVar19);
          handle._M_i = (__int_type)pfStack_1428;
          pfStack_1460 = (fdb_kvs_handle *)0x112d3e;
          sVar9 = strlen(unaff_R12);
          pfStack_1460 = (fdb_kvs_handle *)0x112d56;
          in_RCX = pfVar10;
          fVar5 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,unaff_R12,sVar9 + 1,pfVar10,0x20);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfStack_1460 = (fdb_kvs_handle *)0x112f50;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00112f50;
          }
          uVar18 = (int)pcVar19 + 1;
          pcVar19 = (char *)(ulong)uVar18;
        } while (uVar18 != 3000);
      }
      pfStack_1460 = (fdb_kvs_handle *)0x112d74;
      fVar5 = fdb_iterator_next(pfStack_1440);
      pfVar17 = (fdb_kvs_handle *)(ulong)(uint)fVar5;
      pfStack_1460 = (fdb_kvs_handle *)0x112d81;
      fVar7 = fdb_iterator_next(pfStack_1408);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00112fd0;
      }
      else if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_00112fcb;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if (uStack_1444 != 300) goto LAB_0011302a;
    pfStack_1460 = (fdb_kvs_handle *)0x112db8;
    fVar5 = fdb_iterator_close(pfStack_1440);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011302f;
    pfStack_1460 = (fdb_kvs_handle *)0x112dca;
    fVar5 = fdb_iterator_close(pfStack_1408);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113034;
    unaff_R12 = auStack_13c8;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1450 = (fdb_kvs_handle *)0x0;
      pfStack_1460 = (fdb_kvs_handle *)0x112dfb;
      fVar5 = fdb_iterator_get(pfStack_1418,(fdb_doc **)&pfStack_1450);
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1460 = (fdb_kvs_handle *)0x112e16;
      sprintf(unaff_R12,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar10->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x112e44;
      sprintf((char *)pfVar10,"value%08d",handle._M_i);
      pfVar17 = pfStack_1450;
      handle_00 = (char *)pfStack_1450->op_stats;
      pfStack_1460 = (fdb_kvs_handle *)0x112e5b;
      iVar6 = bcmp(handle_00,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
      if (iVar6 != 0) goto LAB_00112fb0;
      handle_00 = (char *)(pfVar17->field_6).seqtree;
      pfStack_1460 = (fdb_kvs_handle *)0x112e76;
      iVar6 = bcmp(handle_00,pfVar10,(size_t)(pfVar17->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00112fc0;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_1460 = (fdb_kvs_handle *)0x112e88;
      fdb_doc_free((fdb_doc *)pfVar17);
      pfStack_1460 = (fdb_kvs_handle *)0x112e92;
      fVar5 = fdb_iterator_next(pfStack_1418);
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_00113039;
    pfStack_1460 = (fdb_kvs_handle *)0x112eb0;
    fVar5 = fdb_iterator_close(pfStack_1418);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011303e;
    pfStack_1460 = (fdb_kvs_handle *)0x112ec2;
    fVar5 = fdb_kvs_close(pfStack_1438);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113043;
    pfStack_1460 = (fdb_kvs_handle *)0x112ed4;
    fVar5 = fdb_kvs_close(pfStack_1420);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113048;
    pfStack_1460 = (fdb_kvs_handle *)0x112ee6;
    fVar5 = fdb_close(pfStack_1410);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011304d;
    pfStack_1460 = (fdb_kvs_handle *)0x112ef3;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1460 = (fdb_kvs_handle *)0x112f03;
      free(pfVar10);
      pfStack_1460 = (fdb_kvs_handle *)0x112f08;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1460 = (fdb_kvs_handle *)0x112f39;
      fprintf(_stderr,pcVar19,"in-memory snapshot on dirty HB+trie nodes test");
      return;
    }
  }
  else {
LAB_00112fd5:
    pfStack_1460 = (fdb_kvs_handle *)0x112fda;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar19 = (char *)pfVar17;
LAB_00112fda:
    pfStack_1460 = (fdb_kvs_handle *)0x112fdf;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fdf:
    pfStack_1460 = (fdb_kvs_handle *)0x112fe4;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe4:
    pfStack_1460 = (fdb_kvs_handle *)0x112fe9;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe9:
    pfStack_1460 = (fdb_kvs_handle *)0x112fee;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar17 = (fdb_kvs_handle *)pcVar19;
LAB_00112fee:
    pcVar19 = (char *)pfVar17;
    pfStack_1460 = (fdb_kvs_handle *)0x112ff3;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff3:
    pfStack_1460 = (fdb_kvs_handle *)0x112ff8;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff8:
    pfStack_1460 = (fdb_kvs_handle *)0x112ffd;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ffd:
    pfStack_1460 = (fdb_kvs_handle *)0x113002;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113002:
    pfStack_1460 = (fdb_kvs_handle *)0x113007;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar17 = (fdb_kvs_handle *)pcVar19;
LAB_00113007:
    pfStack_1460 = (fdb_kvs_handle *)0x11300c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011300c:
    pfStack_1460 = (fdb_kvs_handle *)0x113011;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113011:
    pfStack_1460 = (fdb_kvs_handle *)0x113016;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113016:
    pfStack_1460 = (fdb_kvs_handle *)0x11301b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011301b:
    pfStack_1460 = (fdb_kvs_handle *)0x113020;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113020:
    pfStack_1460 = (fdb_kvs_handle *)0x113025;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113025:
    pfStack_1460 = (fdb_kvs_handle *)0x11302a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302a:
    pfStack_1460 = (fdb_kvs_handle *)0x11302f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302f:
    pfStack_1460 = (fdb_kvs_handle *)0x113034;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113034:
    pfStack_1460 = (fdb_kvs_handle *)0x113039;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113039:
    pfStack_1460 = (fdb_kvs_handle *)0x11303e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011303e:
    pfStack_1460 = (fdb_kvs_handle *)0x113043;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113043:
    pfStack_1460 = (fdb_kvs_handle *)0x113048;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113048:
    pfStack_1460 = (fdb_kvs_handle *)0x11304d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011304d:
    pfStack_1460 = (fdb_kvs_handle *)0x113052;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_1460 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_1878 = (fdb_kvs_handle *)0x113077;
  pfStack_1488 = pfVar10;
  pfStack_1480 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1478 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1470 = pfVar17;
  pfStack_1468 = (fdb_kvs_handle *)handle_00;
  pfStack_1460 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_17a0,(__timezone_ptr_t)0x0);
  auStack_1868._4_2_ = 100;
  auStack_1868._0_4_ = 0x3530256b;
  auStack_1840._8_2_ = 100;
  auStack_1840._0_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_strncpy(acStack_1588,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1590 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_1878 = (fdb_kvs_handle *)0x1130c4;
  system((char *)&pfStack_1590);
  pfStack_1878 = (fdb_kvs_handle *)0x1130c9;
  memleak_start();
  pfStack_1878 = (fdb_kvs_handle *)0x1130d3;
  pfVar10 = (fdb_kvs_handle *)malloc(0x20);
  pfVar17 = (fdb_kvs_handle *)((long)apbStack_1790 + 0x108);
  pfStack_1878 = (fdb_kvs_handle *)0x1130e6;
  fdb_get_default_config();
  uStack_1668 = 0x201;
  auStack_1688[0x18] = '\x01';
  auStack_1688._16_8_ = (fdb_txn *)0x2;
  uStack_1648 = 1;
  auStack_1688._8_8_ = (fdb_log_callback)0x0;
  pcStack_1630 = cb_inmem_snap;
  uStack_1628 = 2;
  pfStack_1620 = (fdb_txn *)auStack_1810;
  pfStack_1878 = (fdb_kvs_handle *)0x113130;
  fdb_get_default_kvs_config();
  pfStack_1878 = (fdb_kvs_handle *)0x113144;
  fVar5 = fdb_open(&pfStack_1860,"./mvcc_test",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_1810 + 0x28);
    pfStack_1878 = (fdb_kvs_handle *)0x11316a;
    fVar5 = fdb_kvs_open(pfStack_1860,(fdb_kvs_handle **)(auStack_1840 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113549;
    in_RCX = (fdb_kvs_handle *)(auStack_1810 + 0x28);
    pfStack_1878 = (fdb_kvs_handle *)0x113190;
    fVar5 = fdb_kvs_open(pfStack_1860,(fdb_kvs_handle **)(auStack_1840 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011354e;
    auStack_1810._0_8_ = auStack_1840._24_8_;
    auStack_1810._8_8_ = (btree *)0xa;
    auStack_1810._24_8_ = auStack_1868;
    handle_00 = auStack_1840;
    auStack_1810._16_4_ = 0x20;
    pfVar17 = (fdb_kvs_handle *)((long)&pfVar10->kvs + 2);
    unaff_R12 = (char *)apbStack_1790;
    handle._M_i = 0;
    auStack_1810._32_8_ = handle_00;
    do {
      pfStack_1878 = (fdb_kvs_handle *)0x1131ec;
      sprintf(unaff_R12,auStack_1868,handle._M_i);
      *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar10->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
      *(undefined2 *)((long)&pfVar10->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
      pfStack_1878 = (fdb_kvs_handle *)0x113217;
      sprintf((char *)pfVar10,handle_00,handle._M_i);
      unaff_R13 = (char *)auStack_1840._16_8_;
      pfStack_1878 = (fdb_kvs_handle *)0x113224;
      sVar9 = strlen(unaff_R12);
      pfStack_1878 = (fdb_kvs_handle *)0x11323c;
      in_RCX = pfVar10;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar9 + 1,pfVar10,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1878 = (fdb_kvs_handle *)0x11350e;
        in_memory_snapshot_compaction_test();
        goto LAB_0011350e;
      }
      uVar18 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar18;
    } while (uVar18 != 10);
    pfStack_1878 = (fdb_kvs_handle *)0x11325a;
    fVar5 = fdb_commit(pfStack_1860,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113553;
    pfStack_1878 = (fdb_kvs_handle *)0x113273;
    fVar5 = fdb_compact(pfStack_1860,"./mvcc_test2");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113558;
    pfStack_1878 = (fdb_kvs_handle *)0x113291;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1840._16_8_,&pfStack_1850,0xffffffffffffffff
                             );
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011355d;
    pfStack_1878 = (fdb_kvs_handle *)0x1132ab;
    fVar5 = fdb_get_kvs_info(pfStack_1850,(fdb_kvs_info *)&phStack_17d0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113562;
    if (pkStack_17c8 != (kvs_ops_stat *)0xb) {
      pfStack_1878 = (fdb_kvs_handle *)0x1132cb;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1878 = (fdb_kvs_handle *)0x1132eb;
    fVar5 = fdb_iterator_init(pfStack_1850,&pfStack_1848,(void *)0x0,0,(void *)0x0,0,0);
    pfVar14 = (fdb_kvs_handle *)unaff_R13;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113567;
    handle_00 = (char *)apbStack_1790;
    handle._M_i = 0;
    do {
      pfStack_1858 = (fdb_kvs_handle *)0x0;
      pfStack_1878 = (fdb_kvs_handle *)0x113315;
      fVar5 = fdb_iterator_get(pfStack_1848,(fdb_doc **)&pfStack_1858);
      unaff_R13 = (char *)pfStack_1858;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((uint)handle._M_i < 10) {
        pfStack_1878 = (fdb_kvs_handle *)0x113333;
        sprintf(handle_00,auStack_1868,handle._M_i);
        *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar10->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar10->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar10->kvs + 4) = 0x78787878;
        *(undefined2 *)((long)&pfVar10->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
        pfStack_1878 = (fdb_kvs_handle *)0x113360;
        sprintf((char *)pfVar10,auStack_1840,handle._M_i);
        unaff_R13 = (char *)pfStack_1858;
        unaff_R12 = (char *)pfStack_1858->op_stats;
        pfStack_1878 = (fdb_kvs_handle *)0x113378;
        iVar6 = bcmp(unaff_R12,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_1858->kvs_config);
        if (iVar6 != 0) goto LAB_00113529;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_1878 = (fdb_kvs_handle *)0x113393;
        iVar6 = bcmp(unaff_R12,pfVar10,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113539;
      }
      else {
        apbStack_1790[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(undefined8 *)&pfVar10->kvs_config = 0x756c61765f77656e;
        *(undefined2 *)&(pfVar10->kvs_config).custom_cmp = 0x65;
        unaff_R12 = (char *)pfStack_1858->op_stats;
        pfStack_1878 = (fdb_kvs_handle *)0x1133d9;
        iVar6 = bcmp(unaff_R12,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_1858->kvs_config);
        if (iVar6 != 0) goto LAB_0011350e;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_1878 = (fdb_kvs_handle *)0x1133f4;
        iVar6 = bcmp(unaff_R12,pfVar10,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_0011351e;
      }
      handle._M_i = (__int_type)((uint)handle._M_i + 1);
      pfStack_1878 = (fdb_kvs_handle *)0x113408;
      fdb_doc_free((fdb_doc *)pfStack_1858);
      pfStack_1878 = (fdb_kvs_handle *)0x113412;
      fVar5 = fdb_iterator_next(pfStack_1848);
      pfVar14 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 0xb) goto LAB_0011356c;
    pfStack_1878 = (fdb_kvs_handle *)0x11342d;
    fVar5 = fdb_iterator_close(pfStack_1848);
    _Var13._M_i = (__int_type)pfStack_1850;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113571;
    handle_00 = (char *)apbStack_1790;
    pfStack_1878 = (fdb_kvs_handle *)0x11344a;
    sVar9 = strlen(handle_00);
    in_RCX = (fdb_kvs_handle *)(auStack_1840 + 0x28);
    pfStack_1878 = (fdb_kvs_handle *)0x113463;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)_Var13._M_i,handle_00,sVar9 + 1,(void **)in_RCX,
                       (size_t *)(auStack_1840 + 0x20));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113576;
    pfStack_1878 = (fdb_kvs_handle *)0x113480;
    _Var20._M_i = (__int_type)pfVar10;
    iVar6 = bcmp((void *)auStack_1840._40_8_,pfVar10,auStack_1840._32_8_);
    _Var13._M_i = auStack_1840._40_8_;
    if (iVar6 != 0) goto LAB_0011357b;
    pfStack_1878 = (fdb_kvs_handle *)0x113490;
    fdb_free_block((void *)auStack_1840._40_8_);
    pfStack_1878 = (fdb_kvs_handle *)0x11349a;
    fdb_kvs_close(pfStack_1850);
    pfStack_1878 = (fdb_kvs_handle *)0x1134a4;
    fVar5 = fdb_close(pfStack_1860);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113586;
    pfStack_1878 = (fdb_kvs_handle *)0x1134b1;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1878 = (fdb_kvs_handle *)0x1134c1;
      free(pfVar10);
      pfStack_1878 = (fdb_kvs_handle *)0x1134c6;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1878 = (fdb_kvs_handle *)0x1134f7;
      fprintf(_stderr,pcVar19,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_00113544:
    pfStack_1878 = (fdb_kvs_handle *)0x113549;
    in_memory_snapshot_compaction_test();
LAB_00113549:
    pfStack_1878 = (fdb_kvs_handle *)0x11354e;
    in_memory_snapshot_compaction_test();
LAB_0011354e:
    pfStack_1878 = (fdb_kvs_handle *)0x113553;
    in_memory_snapshot_compaction_test();
LAB_00113553:
    pfStack_1878 = (fdb_kvs_handle *)0x113558;
    in_memory_snapshot_compaction_test();
LAB_00113558:
    pfStack_1878 = (fdb_kvs_handle *)0x11355d;
    in_memory_snapshot_compaction_test();
LAB_0011355d:
    pfStack_1878 = (fdb_kvs_handle *)0x113562;
    in_memory_snapshot_compaction_test();
LAB_00113562:
    pfStack_1878 = (fdb_kvs_handle *)0x113567;
    in_memory_snapshot_compaction_test();
    pfVar14 = (fdb_kvs_handle *)unaff_R13;
LAB_00113567:
    pfStack_1878 = (fdb_kvs_handle *)0x11356c;
    in_memory_snapshot_compaction_test();
LAB_0011356c:
    pfStack_1878 = (fdb_kvs_handle *)0x113571;
    in_memory_snapshot_compaction_test();
LAB_00113571:
    _Var13._M_i = (__int_type)pfVar17;
    pfStack_1878 = (fdb_kvs_handle *)0x113576;
    in_memory_snapshot_compaction_test();
LAB_00113576:
    pfStack_1878 = (fdb_kvs_handle *)0x11357b;
    in_memory_snapshot_compaction_test();
LAB_0011357b:
    pfStack_1878 = (fdb_kvs_handle *)0x113586;
    _Var20._M_i = _Var13._M_i;
    in_memory_snapshot_compaction_test();
LAB_00113586:
    pfStack_1878 = (fdb_kvs_handle *)0x11358b;
    in_memory_snapshot_compaction_test();
  }
  pfStack_1878 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar16 = _Var20._M_i & 0xffffffff;
  pfVar17 = (fdb_kvs_handle *)0x0;
  pcStack_1b30 = (code *)0x1135b8;
  pfStack_18a0 = pfVar10;
  pfStack_1898 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1890 = pfVar14;
  pfStack_1888 = (fdb_kvs_handle *)_Var13._M_i;
  pfStack_1880 = (fdb_kvs_handle *)handle_00;
  pfStack_1878 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)auStack_1ab8,(__timezone_ptr_t)0x0);
  if ((int)_Var20._M_i != 2) {
    return;
  }
  pfVar10 = extraout_RDX;
  if (extraout_RDX == (fdb_kvs_handle *)0x0) {
LAB_00113ad8:
    pcStack_1b30 = (code *)0x113add;
    cb_inmem_snap();
LAB_00113add:
    pcStack_1b30 = (code *)0x113ae2;
    cb_inmem_snap();
LAB_00113ae2:
    pcStack_1b30 = (code *)0x113ae7;
    cb_inmem_snap();
LAB_00113ae7:
    pcStack_1b30 = (code *)0x113aec;
    cb_inmem_snap();
LAB_00113aec:
    pcStack_1b30 = (code *)0x113af1;
    cb_inmem_snap();
LAB_00113af1:
    pcStack_1b30 = (code *)0x113af6;
    cb_inmem_snap();
LAB_00113af6:
    pcStack_1b30 = (code *)0x113afb;
    cb_inmem_snap();
    pfVar15 = pfVar10;
LAB_00113afb:
    pcStack_1b30 = (code *)0x113b00;
    cb_inmem_snap();
LAB_00113b00:
    pfVar10 = in_RCX;
    pcStack_1b30 = (code *)0x113b05;
    cb_inmem_snap();
LAB_00113b05:
    pcStack_1b30 = (code *)0x113b0a;
    cb_inmem_snap();
  }
  else {
    pfVar10 = (fdb_kvs_handle *)
              CONCAT26(auStack_1868._6_2_,CONCAT24(auStack_1868._4_2_,auStack_1868._0_4_));
    pfVar17 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar6 = *(int *)((long)&(pfVar10->kvs_config).custom_cmp + 4);
    *(int *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = iVar6 + 1;
    if (iVar6 != 4) {
      if (iVar6 != 1) {
        return;
      }
      pcStack_1b30 = (code *)0x113607;
      fVar5 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar10->kvs_config,&pfStack_1b10,
                                0xffffffffffffffff);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113add;
      pcStack_1b30 = (code *)0x11361e;
      fVar5 = fdb_get_kvs_info(pfStack_1b10,&fStack_1ae8);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
      in_RCX = (fdb_kvs_handle *)&(pfVar10->kvs_config).custom_cmp;
      if (fStack_1ae8.last_seqnum != (long)*(int *)&(pfVar10->kvs_config).custom_cmp) {
        pcStack_1b30 = (code *)0x113a46;
        cb_inmem_snap();
      }
      pcStack_1b30 = (code *)0x113663;
      pfStack_1b08 = pfVar17;
      pp_Stack_1b00 = (fdb_custom_cmp_variable *)in_RCX;
      fVar5 = fdb_iterator_init(pfStack_1b10,&pfStack_1b18,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfVar10 = (fdb_kvs_handle *)(auStack_1ab8 + 10);
        pcVar19 = auStack_1aae + 6;
        uVar16 = 0;
        do {
          pfStack_1b20 = (fdb_kvs_handle *)0x0;
          pcStack_1b30 = (code *)0x11369a;
          fVar5 = fdb_iterator_get(pfStack_1b18,(fdb_doc **)&pfStack_1b20);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          lVar22 = CONCAT26(auStack_1868._6_2_,CONCAT24(auStack_1868._4_2_,auStack_1868._0_4_));
          pcStack_1b30 = (code *)0x1136ba;
          sprintf((char *)afStack_19a8,*(char **)(lVar22 + 0x18),uVar16);
          sVar9 = (size_t)*(int *)(lVar22 + 0x10);
          pcStack_1b30 = (code *)0x1136ce;
          memset(pcVar19,0x78,sVar9);
          *(undefined4 *)(&(pfVar10->kvs_config).create_if_missing + sVar9) = 0x646e653c;
          *(undefined2 *)(auStack_1aae + sVar9 + 4) = 0x3e;
          pcStack_1b30 = (code *)0x1136ee;
          sprintf(pcVar19,*(char **)(lVar22 + 0x20),uVar16);
          pfVar14 = pfStack_1b20;
          in_RCX = (fdb_kvs_handle *)pfStack_1b20->op_stats;
          pcStack_1b30 = (code *)0x113706;
          iVar6 = bcmp(in_RCX,afStack_19a8,*(size_t *)&pfStack_1b20->kvs_config);
          if (iVar6 != 0) {
            pcStack_1b30 = (code *)0x113a88;
            cb_inmem_snap();
LAB_00113a88:
            pcStack_1b30 = (code *)0x113a98;
            cb_inmem_snap();
            goto LAB_00113a98;
          }
          in_RCX = (fdb_kvs_handle *)(pfVar14->field_6).seqtree;
          pcStack_1b30 = (code *)0x113721;
          iVar6 = bcmp(in_RCX,pcVar19,(size_t)(pfVar14->kvs_config).custom_cmp_param);
          if (iVar6 != 0) goto LAB_00113a88;
          uVar16 = (ulong)((int)uVar16 + 1);
          pcStack_1b30 = (code *)0x113733;
          fdb_doc_free((fdb_doc *)pfVar14);
          pcStack_1b30 = (code *)0x11373d;
          fVar5 = fdb_iterator_next(pfStack_1b18);
        } while (fVar5 == FDB_RESULT_SUCCESS);
        if ((int)uVar16 != *(int *)pp_Stack_1b00) {
          pcStack_1b30 = (code *)0x113a64;
          cb_inmem_snap();
        }
        pcStack_1b30 = (code *)0x11375c;
        fVar5 = fdb_iterator_close(pfStack_1b18);
        pfVar17 = pfStack_1b08;
        if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00113a19;
        pcStack_1b30 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
      goto LAB_00113af1;
    }
LAB_0011376e:
    pfStack_1b08 = pfVar17;
    in_RCX = (fdb_kvs_handle *)afStack_19a8;
    afStack_19a8[0].algorithm = 0x5f77656e;
    builtin_memcpy(&afStack_19a8[0].algorithm,"key",4);
    pfVar14 = (fdb_kvs_handle *)(auStack_1aae + 6);
    auStack_1aae._6_8_ = 0x756c61765f77656e;
    uStack_1aa0 = 0x65;
    pfVar17 = *(fdb_kvs_handle **)&pfVar10->kvs_config;
    pcStack_1b30 = (code *)0x1137b0;
    sVar9 = strlen((char *)in_RCX);
    unaff_R12 = (char *)(sVar9 + 1);
    pcStack_1b30 = (code *)0x1137bc;
    sVar9 = strlen((char *)pfVar14);
    pcStack_1b30 = (code *)0x1137d1;
    fVar5 = fdb_set_kv(pfVar17,in_RCX,(size_t)unaff_R12,pfVar14,sVar9 + 1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
    pcStack_1b30 = (code *)0x1137ed;
    fVar5 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar10->kvs_config,&pfStack_1b10,
                              0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
    pcStack_1b30 = (code *)0x113804;
    fVar5 = fdb_get_kvs_info(pfStack_1b10,&fStack_1ae8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
    in_RCX = (fdb_kvs_handle *)&(pfVar10->kvs_config).custom_cmp;
    if (fStack_1ae8.last_seqnum != (long)*(int *)&(pfVar10->kvs_config).custom_cmp + 1U) {
      pcStack_1b30 = (code *)0x113a58;
      cb_inmem_snap();
    }
    pcStack_1b30 = (code *)0x113842;
    fVar5 = fdb_iterator_init(pfStack_1b10,&pfStack_1b18,(void *)0x0,0,(void *)0x0,0,0);
    pfVar15 = pfVar10;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
    unaff_R12 = auStack_1aae + 6;
    uVar16 = 0;
    do {
      pfStack_1b20 = (fdb_kvs_handle *)0x0;
      pcStack_1b30 = (code *)0x113874;
      fVar5 = fdb_iterator_get(pfStack_1b18,(fdb_doc **)&pfStack_1b20);
      pfVar10 = pfStack_1b20;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar16 < *(int *)in_RCX) {
        lVar22 = CONCAT26(auStack_1868._6_2_,CONCAT24(auStack_1868._4_2_,auStack_1868._0_4_));
        pcStack_1b30 = (code *)0x11389c;
        sprintf((char *)afStack_19a8,*(char **)(lVar22 + 0x18),uVar16);
        sVar9 = (size_t)*(int *)(lVar22 + 0x10);
        pcStack_1b30 = (code *)0x1138b0;
        memset(unaff_R12,0x78,sVar9);
        *(undefined4 *)(auStack_1ab8 + sVar9 + 10) = 0x646e653c;
        *(undefined2 *)(auStack_1aae + sVar9 + 4) = 0x3e;
        pcStack_1b30 = (code *)0x1138d5;
        sprintf(unaff_R12,*(char **)(lVar22 + 0x20),uVar16);
        pfVar10 = pfStack_1b20;
        pfVar14 = (fdb_kvs_handle *)pfStack_1b20->op_stats;
        pcStack_1b30 = (code *)0x1138ec;
        iVar6 = bcmp(pfVar14,afStack_19a8,*(size_t *)&pfStack_1b20->kvs_config);
        if (iVar6 != 0) goto LAB_00113aa8;
        pfVar14 = (fdb_kvs_handle *)(pfVar10->field_6).seqtree;
        pcStack_1b30 = (code *)0x113907;
        iVar6 = bcmp(pfVar14,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113ab8;
      }
      else {
        afStack_19a8[0].algorithm = 0x5f77656e;
        builtin_memcpy(&afStack_19a8[0].algorithm,"key",4);
        auStack_1aae._6_8_ = 0x756c61765f77656e;
        uStack_1aa0 = 0x65;
        pfVar14 = (fdb_kvs_handle *)pfStack_1b20->op_stats;
        pcStack_1b30 = (code *)0x113955;
        iVar6 = bcmp(pfVar14,afStack_19a8,*(size_t *)&pfStack_1b20->kvs_config);
        if (iVar6 != 0) goto LAB_00113ac8;
        pfVar14 = (fdb_kvs_handle *)(pfVar10->field_6).seqtree;
        pcStack_1b30 = (code *)0x113970;
        iVar6 = bcmp(pfVar14,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113a98;
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      pcStack_1b30 = (code *)0x113984;
      fdb_doc_free((fdb_doc *)pfStack_1b20);
      pcStack_1b30 = (code *)0x11398e;
      fVar5 = fdb_iterator_next(pfStack_1b18);
      pfVar15 = pfVar10;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)uVar16 != *(int *)in_RCX + 1) {
      pcStack_1b30 = (code *)0x113a73;
      cb_inmem_snap();
    }
    pcStack_1b30 = (code *)0x1139ac;
    fVar5 = fdb_iterator_close(pfStack_1b18);
    pfVar17 = pfStack_1b08;
    pfVar10 = pfStack_1b10;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
    pfVar15 = (fdb_kvs_handle *)afStack_19a8;
    pcStack_1b30 = (code *)0x1139ce;
    sVar9 = strlen((char *)pfVar15);
    pcStack_1b30 = (code *)0x1139e7;
    fVar5 = fdb_get_kv(pfVar10,pfVar15,sVar9 + 1,&pfStack_1af0,&sStack_1af8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
    pcStack_1b30 = (code *)0x113a09;
    iVar6 = bcmp(pfStack_1af0,auStack_1aae + 6,sStack_1af8);
    pfVar10 = pfStack_1af0;
    if (iVar6 == 0) {
      pcStack_1b30 = (code *)0x113a19;
      fdb_free_block(pfStack_1af0);
LAB_00113a19:
      pcStack_1b30 = (code *)0x113a23;
      fdb_kvs_close(pfStack_1b10);
      return;
    }
  }
  pcStack_1b30 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_20a8 = (fdb_iterator *)0x113b3a;
  fStack_1d50.bub_ctx.space_used = (uint64_t)pfVar10;
  fStack_1d50.bub_ctx.handle = (fdb_kvs_handle *)unaff_R12;
  pfStack_1b48 = pfVar14;
  pfStack_1b40 = pfVar15;
  pfStack_1b38 = pfVar17;
  pcStack_1b30 = (code *)uVar16;
  gettimeofday(&tStack_1f78,(__timezone_ptr_t)0x0);
  pfStack_20a8 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_20a8 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar10 = (fdb_kvs_handle *)&fStack_1d50.config.encryption_key;
  pfStack_20a8 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1f68;
  pfStack_20a8 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_1d50.config.encryption_key.bytes[4] = '\0';
  fStack_1d50.config.encryption_key.bytes[5] = '\0';
  fStack_1d50.config.encryption_key.bytes[6] = '\0';
  fStack_1d50.config.encryption_key.bytes[7] = '\0';
  fStack_1d50.config.encryption_key.bytes[8] = '\0';
  fStack_1d50.config.encryption_key.bytes[9] = '\0';
  fStack_1d50.config.encryption_key.bytes[10] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xb] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xc] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1d50.config.encryption_key.bytes[0xe] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xf] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x10] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x11] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x12] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x13] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_1d50.config._180_4_ = 1;
  fStack_1d50.config.block_reusing_threshold._7_1_ = 0;
  pfStack_20a8 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)(auStack_2088 + 0x10);
  pfStack_20a8 = (fdb_iterator *)0x113baf;
  fVar5 = fdb_open((fdb_file_handle **)pfVar17,"./mvcc_test1",(fdb_config *)pfVar10);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar5;
  pfStack_20a8 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2088._16_8_,&pfStack_2098,(fdb_kvs_config *)config);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_20a8 = (fdb_iterator *)0x113bda;
    fVar5 = fdb_snapshot_open(pfStack_2098,(fdb_kvs_handle **)(auStack_2088 + 8),0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_20a8 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2088._8_8_,(fdb_kvs_info *)(apfStack_1fd8 + 6));
    if ((fdb_kvs_handle *)fStack_1fa8.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_20a8 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar17 = (fdb_kvs_handle *)auStack_2088;
    pfStack_20a8 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_2088._8_8_,(fdb_iterator **)pfVar17,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_20a8 = (fdb_iterator *)0x113c32;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2088._0_8_);
    pfVar15 = (fdb_kvs_handle *)unaff_R12;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_20a8 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_2088._0_8_);
    pfStack_20a8 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2088._8_8_);
    lVar22 = 0;
    uVar16 = 0;
    do {
      pfStack_20a8 = (fdb_iterator *)0x113c71;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_1e50,"meta%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_1d50,"body%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113cb9;
      sVar9 = strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x113cc4;
      sVar11 = strlen((char *)&fStack_1e50);
      pfStack_20a8 = (fdb_iterator *)0x113ccf;
      sVar12 = strlen((char *)&fStack_1d50);
      pfStack_20a8 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_2050 + lVar22),auStack_1f68 + 0x18,sVar9,&fStack_1e50,
                     sVar11,&fStack_1d50,sVar12);
      pfStack_20a8 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_2098,*(fdb_doc **)(auStack_2050 + uVar16 * 8));
      uVar16 = uVar16 + 1;
      lVar22 = lVar22 + 8;
    } while (uVar16 != 5);
    pfStack_20a8 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\x01');
    uVar16 = 5;
    ppfVar24 = (fdb_doc **)(auStack_2050 + 0x28);
    do {
      pfStack_20a8 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_1e50,"meta%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_1d50,"body%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113d8a;
      sVar9 = strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x113d95;
      sVar11 = strlen((char *)&fStack_1e50);
      pfStack_20a8 = (fdb_iterator *)0x113da0;
      sVar12 = strlen((char *)&fStack_1d50);
      pfStack_20a8 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(ppfVar24,auStack_1f68 + 0x18,sVar9,&fStack_1e50,sVar11,&fStack_1d50,sVar12);
      pfStack_20a8 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_2098,*ppfVar24);
      uVar16 = uVar16 + 1;
      ppfVar24 = ppfVar24 + 1;
    } while (uVar16 != 9);
    pfVar10 = (fdb_kvs_handle *)(auStack_1f68 + 0x18);
    pfStack_20a8 = (fdb_iterator *)0x113dfc;
    sprintf((char *)pfVar10,"key%d",9);
    config = &fStack_1e50;
    pfStack_20a8 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config,"meta%d",9);
    pfVar15 = &fStack_1d50;
    pfStack_20a8 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar15,"Body%d",9);
    pfVar17 = (fdb_kvs_handle *)(auStack_2050 + 0x48);
    pfStack_20a8 = (fdb_iterator *)0x113e48;
    pfVar14 = (fdb_kvs_handle *)strlen((char *)pfVar10);
    pfStack_20a8 = (fdb_iterator *)0x113e53;
    doc_00 = (fdb_iterator *)strlen((char *)config);
    pfStack_20a8 = (fdb_iterator *)0x113e5e;
    sVar9 = strlen((char *)pfVar15);
    pfStack_20a8 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar17,pfVar10,(size_t)pfVar14,config,(size_t)doc_00,pfVar15,sVar9);
    pfStack_20a8 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_2098,(fdb_doc *)auStack_2050._72_8_);
    pfStack_20a8 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    **(undefined1 **)(auStack_2050._72_8_ + 0x40) = 0x62;
    pfStack_20a8 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_2098,(fdb_doc *)auStack_2050._72_8_);
    pfStack_20a8 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    pfStack_2068 = *(fdb_kvs_handle **)(auStack_2050._72_8_ + 0x28);
    pfStack_20a8 = (fdb_iterator *)0x113ed7;
    fVar5 = fdb_snapshot_open(pfStack_2098,&pfStack_2058,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_20a8 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_2098,(fdb_doc *)auStack_2050._72_8_);
    pfStack_20a8 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    uVar16 = 10;
    pfVar17 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_20a8 = (fdb_iterator *)0x113f24;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_1e50,"meta%d",uVar16 & 0xffffffff);
      pfVar15 = &fStack_1d50;
      pfStack_20a8 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar15,"body%d",uVar16 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_2050 + (long)pfVar17);
      pfStack_20a8 = (fdb_iterator *)0x113f6c;
      pfVar10 = (fdb_kvs_handle *)strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x113f77;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)&fStack_1e50);
      pfStack_20a8 = (fdb_iterator *)0x113f82;
      sVar9 = strlen((char *)pfVar15);
      pfStack_20a8 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_00,auStack_1f68 + 0x18,(size_t)pfVar10,&fStack_1e50,
                     (size_t)pfVar14,pfVar15,sVar9);
      pfStack_20a8 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_2098,*(fdb_doc **)(auStack_2050 + uVar16 * 8));
      uVar16 = uVar16 + 1;
      pfVar17 = (fdb_kvs_handle *)((long)pfVar17 + 8);
    } while (uVar16 != 0xf);
    pfStack_20a8 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\x01');
    pfStack_20a8 = (fdb_iterator *)0x113fee;
    fVar5 = fdb_set_log_callback(pfStack_2098,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_20a8 = (fdb_iterator *)0x11400a;
    fVar5 = fdb_snapshot_open(pfStack_2098,(fdb_kvs_handle **)(auStack_2088 + 8),999999);
    pfVar10 = pfStack_2068;
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_20a8 = (fdb_iterator *)0x11402a;
    fVar5 = fdb_snapshot_open(pfStack_2098,(fdb_kvs_handle **)(auStack_2088 + 8),
                              (fdb_seqnum_t)pfStack_2068);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_20a8 = (fdb_iterator *)0x114044;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2088._8_8_,&pfStack_2070,
                              (fdb_seqnum_t)pfVar10);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_20a8 = (fdb_iterator *)0x114056;
    fVar5 = fdb_kvs_close((fdb_kvs_handle *)auStack_2088._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_20a8 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_2070,(fdb_kvs_info *)(apfStack_1fd8 + 6));
    if ((fdb_kvs_handle *)fStack_1fa8.last_seqnum != pfVar10) {
      pfStack_20a8 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar16 = 0xf;
    config = (fdb_iterator *)apfStack_1fd8;
    do {
      pfStack_20a8 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar16 & 0xffffffff);
      doc_00 = &fStack_1e50;
      pfStack_20a8 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_00,"meta%d",uVar16 & 0xffffffff);
      pfVar10 = &fStack_1d50;
      pfStack_20a8 = (fdb_iterator *)0x1140e7;
      sprintf((char *)pfVar10,"body%d",uVar16 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x1140ef;
      pfVar15 = (fdb_kvs_handle *)strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x1140fa;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_20a8 = (fdb_iterator *)0x114105;
      sVar9 = strlen((char *)pfVar10);
      pfStack_20a8 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config,auStack_1f68 + 0x18,(size_t)pfVar15,doc_00,(size_t)pfVar14,
                     pfVar10,sVar9);
      pfStack_20a8 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_2098,*(fdb_doc **)config);
      uVar16 = uVar16 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar16 != 0x14);
    pfStack_20a8 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    pfStack_20a8 = (fdb_iterator *)0x114165;
    fVar5 = fdb_snapshot_open(pfStack_2058,&pfStack_2060,0xffffffffffffffff);
    pfVar17 = (fdb_kvs_handle *)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar17 = (fdb_kvs_handle *)&pfStack_2090;
    pfStack_20a8 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar17,
                   (void *)(*(size_t **)
                             (auStack_2050 + (((long)pfStack_2068 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_2050 + (((long)pfStack_2068 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_20a8 = (fdb_iterator *)0x1141bd;
    fVar5 = fdb_get_metaonly(pfStack_2070,(fdb_doc *)pfStack_2090);
    if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_20a8 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_2090);
    pfStack_20a8 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_2090,*(kvs_ops_stat **)(auStack_2050._40_8_ + 0x20),
                   *(size_t *)(fdb_kvs_config *)auStack_2050._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_20a8 = (fdb_iterator *)0x114204;
    fVar5 = fdb_get_metaonly(pfStack_2070,(fdb_doc *)pfStack_2090);
    unaff_R12 = (char *)auStack_2050._40_8_;
    doc_01 = pfStack_2090;
    pfVar17 = (fdb_kvs_handle *)&pfStack_2090;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    pfVar10 = (fdb_kvs_handle *)pfStack_2090->op_stats;
    config = *(fdb_iterator **)(auStack_2050._40_8_ + 0x20);
    pfStack_20a8 = (fdb_iterator *)0x11422e;
    iVar6 = bcmp(pfVar10,config,*(size_t *)(fdb_kvs_config *)auStack_2050._40_8_);
    if (iVar6 != 0) goto LAB_001145cc;
    pfVar10 = (fdb_kvs_handle *)doc_01->staletree;
    config = *(fdb_iterator **)((long)unaff_R12 + 0x38);
    pfStack_20a8 = (fdb_iterator *)0x11424f;
    iVar6 = bcmp(pfVar10,config,(size_t)((fdb_kvs_config *)unaff_R12)->custom_cmp);
    if (iVar6 != 0) goto LAB_001145d7;
    pfStack_20a8 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_20a8 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_2090,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_2090->fhandle = (fdb_file_handle *)0x6;
    pfStack_20a8 = (fdb_iterator *)0x114295;
    fVar5 = fdb_get_byseq(pfStack_2070,(fdb_doc *)pfStack_2090);
    pfVar17 = pfStack_2090;
    doc_01 = (fdb_kvs_handle *)&pfStack_2090;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    pfVar10 = (fdb_kvs_handle *)pfStack_2090->op_stats;
    config = *(fdb_iterator **)(auStack_2050._40_8_ + 0x20);
    pfStack_20a8 = (fdb_iterator *)0x1142be;
    iVar6 = bcmp(pfVar10,config,*(size_t *)&pfStack_2090->kvs_config);
    unaff_R12 = (char *)auStack_2050._40_8_;
    if (iVar6 != 0) goto LAB_001145e7;
    pfVar10 = (fdb_kvs_handle *)(pfVar17->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2050._40_8_ + 0x40))->
             seqtree;
    pfStack_20a8 = (fdb_iterator *)0x1142de;
    iVar6 = bcmp(pfVar10,config,(size_t)(pfVar17->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_001145f2;
    pfStack_20a8 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar17);
    pfVar17 = (fdb_kvs_handle *)&pfStack_2090;
    pfStack_2090 = (fdb_kvs_handle *)0x0;
    pfVar14 = (fdb_kvs_handle *)0x0;
    pfStack_20a8 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_2070,(fdb_iterator **)auStack_2088,(void *)0x0,0,(void *)0x0,0,0);
    pfVar15 = pfVar10;
    do {
      pfStack_20a8 = (fdb_iterator *)0x11432a;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2088._0_8_,(fdb_doc **)pfVar17);
      pfVar10 = pfStack_2090;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_20a8 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        pfVar10 = pfVar15;
LAB_00114554:
        pfStack_20a8 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_20a8 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      config = (fdb_iterator *)pfStack_2090->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_2050 + (long)pfVar14 * 8);
      unaff_R12 = (char *)doc_00->_seqnum;
      pfStack_20a8 = (fdb_iterator *)0x114352;
      iVar6 = bcmp(config,unaff_R12,*(size_t *)&pfStack_2090->kvs_config);
      pfVar15 = pfVar10;
      if (iVar6 != 0) {
        pfStack_20a8 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config = (fdb_iterator *)pfVar10->staletree;
      unaff_R12 = (char *)doc_00->tree_cursor_start;
      pfStack_20a8 = (fdb_iterator *)0x114371;
      iVar6 = bcmp(config,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_0011455f;
      config = (fdb_iterator *)(pfVar10->field_6).seqtree;
      unaff_R12 = (char *)doc_00->tree_cursor_prev;
      pfStack_20a8 = (fdb_iterator *)0x114390;
      iVar6 = bcmp(config,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00114554;
      pfStack_20a8 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)pfVar10);
      pfStack_2090 = (fdb_kvs_handle *)0x0;
      pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
      pfStack_20a8 = (fdb_iterator *)0x1143b6;
      pfVar21 = (fdb_iterator *)auStack_2088._0_8_;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2088._0_8_);
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)pfVar14 == 10) {
      pfStack_20a8 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_2088._0_8_);
      pfVar14 = (fdb_kvs_handle *)0x0;
      pfStack_20a8 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_2060,(fdb_iterator **)auStack_2088,(void *)0x0,0,(void *)0x0,0,0);
      pfVar17 = (fdb_kvs_handle *)&pfStack_2090;
      do {
        pfStack_20a8 = (fdb_iterator *)0x114408;
        fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2088._0_8_,(fdb_doc **)pfVar17);
        pfVar10 = pfStack_2090;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        config = (fdb_iterator *)pfStack_2090->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_2050 + (long)pfVar14 * 8);
        unaff_R12 = (char *)doc_00->_seqnum;
        pfStack_20a8 = (fdb_iterator *)0x114430;
        iVar6 = bcmp(config,unaff_R12,*(size_t *)&pfStack_2090->kvs_config);
        if (iVar6 != 0) goto LAB_0011456a;
        config = (fdb_iterator *)pfVar10->staletree;
        unaff_R12 = (char *)doc_00->tree_cursor_start;
        pfStack_20a8 = (fdb_iterator *)0x11444f;
        iVar6 = bcmp(config,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp);
        if (iVar6 != 0) goto LAB_00114585;
        config = (fdb_iterator *)(pfVar10->field_6).seqtree;
        unaff_R12 = (char *)doc_00->tree_cursor_prev;
        pfStack_20a8 = (fdb_iterator *)0x11446e;
        iVar6 = bcmp(config,unaff_R12,(size_t)(pfVar10->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_0011457a;
        pfStack_20a8 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)pfVar10);
        pfStack_2090 = (fdb_kvs_handle *)0x0;
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
        pfStack_20a8 = (fdb_iterator *)0x114494;
        pfVar21 = (fdb_iterator *)auStack_2088._0_8_;
        fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2088._0_8_);
        pfVar15 = pfVar10;
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)pfVar14 == 10) {
        pfStack_20a8 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_2088._0_8_);
        pfStack_20a8 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_2098);
        pfStack_20a8 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_2058);
        pfStack_20a8 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_2060);
        pfStack_20a8 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_2070);
        pfStack_20a8 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_2088._16_8_);
        lVar22 = 0;
        do {
          pfStack_20a8 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_2050 + lVar22 * 8));
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x14);
        pfStack_20a8 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_20a8 = (fdb_iterator *)0x114501;
        memleak_end();
        pcVar19 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        pfStack_20a8 = (fdb_iterator *)0x114532;
        fprintf(_stderr,pcVar19,"snapshot clone test");
        return;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_20a8 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_20a8 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar15 = (fdb_kvs_handle *)unaff_R12;
LAB_0011459a:
    pfStack_20a8 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_20a8 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_20a8 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_20a8 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_20a8 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_20a8 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_20a8 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_20a8 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_20a8 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    unaff_R12 = (char *)pfVar15;
    doc_01 = pfVar17;
    pfStack_20a8 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_20a8 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_20a8 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar17 = doc_01;
    pfStack_20a8 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_20a8 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_20a8 = (fdb_iterator *)0x1145fd;
    pfVar21 = config;
    snapshot_clone_test();
  }
  pfStack_20a8 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_20a8 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_2100 = (fdb_doc *)0x0;
  pfVar15 = pfVar21->handle;
  iVar6 = *(int *)&pfVar21->seqtree_iterator;
  pfStack_20d0 = pfVar17;
  pfStack_20c8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_20c0 = pfVar14;
  pfStack_20b8 = pfVar10;
  pfStack_20b0 = config;
  pfStack_20a8 = doc_00;
  gettimeofday(&tStack_20e0,(__timezone_ptr_t)0x0);
  fVar5 = fdb_snapshot_open((fdb_kvs_handle *)pfVar21->hbtrie_iterator,&pfStack_20e8,
                            0xffffffffffffffff);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar22 = 0;
  iStack_20ec = iVar6;
  fdb_iterator_init(pfStack_20e8,&pfStack_20f8,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar5 = fdb_iterator_get(pfStack_20f8,&pfStack_2100);
    doc = pfStack_2100;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_2100->key;
    lVar2 = *(long *)(&(pfVar15->kvs_config).create_if_missing + lVar22 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar6 = bcmp(pvVar1,pvVar3,pfStack_2100->keylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar6 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc);
    pfStack_2100 = (fdb_doc *)0x0;
    lVar22 = lVar22 + 1;
    fVar5 = fdb_iterator_next(pfStack_20f8);
  } while (fVar5 == FDB_RESULT_SUCCESS);
  if (iStack_20ec / 2 == (int)lVar22) {
    fdb_iterator_close(pfStack_20f8);
    fdb_kvs_close(pfStack_20e8);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void snapshot_stats_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_seqnum_t snap_seq;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info kvs_info;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // ------- Setup test ----------------------------------
    // insert documents
    for (i=0; i<n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // retrieve the sequence number for a snapshot open
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    snap_seq = kvs_info.last_seqnum;

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "snapshot_stats_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Init Snapshot of open file with saved document seqnum as marker
    status = fdb_snapshot_open(db, &snap_db, snap_seq);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    TEST_CHK(kvs_info.doc_count == (size_t)n);
    TEST_CHK(kvs_info.file == dbfile);

    // close snapshot handle
    fdb_kvs_close(snap_db);

    // Test stats by creating an in-memory snapshot
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    TEST_CHK(kvs_info.doc_count == (size_t)n);
    TEST_CHK(kvs_info.file == dbfile);

    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db handle
    fdb_kvs_close(db);
    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("snapshot stats test");
}